

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_h<embree::avx512::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  Geometry *pGVar14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  ulong uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  byte bVar68;
  ulong uVar69;
  ulong uVar70;
  long lVar71;
  bool bVar72;
  long lVar73;
  Geometry *geometry;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined8 unaff_R13;
  ulong uVar74;
  long lVar75;
  byte bVar76;
  float fVar77;
  float fVar124;
  float fVar126;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar78;
  undefined1 auVar84 [16];
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar130;
  undefined4 uVar131;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  float fVar140;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar156;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar157 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  RTCFilterFunctionNArguments args;
  int local_544;
  long local_540;
  Primitive *local_538;
  Ray *local_530;
  ulong local_528;
  ulong local_520;
  ulong local_518;
  Precalculations *local_510;
  float local_504;
  RTCFilterFunctionNArguments local_500;
  undefined8 local_4d0;
  undefined4 local_4c8;
  float local_4c4;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  uint local_4b4;
  uint local_4b0;
  RayQueryContext *local_498;
  Geometry *local_490;
  ulong local_488;
  undefined1 local_480 [32];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_310 [8];
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_510 = pre;
  uVar69 = (ulong)(byte)prim[1];
  fVar156 = *(float *)(prim + uVar69 * 0x19 + 0x12);
  auVar137 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar69 * 0x19 + 6));
  fVar140 = fVar156 * auVar137._0_4_;
  fVar130 = fVar156 * (ray->dir).field_0.m128[0];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar69 * 4 + 6);
  auVar91 = vpmovsxbd_avx2(auVar81);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar69 * 5 + 6);
  auVar88 = vpmovsxbd_avx2(auVar79);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar69 * 6 + 6);
  auVar89 = vpmovsxbd_avx2(auVar6);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar90 = vpmovsxbd_avx2(auVar7);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar69 * 0xc + 6);
  auVar92 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar69 * 0xd + 6);
  auVar93 = vpmovsxbd_avx2(auVar9);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar69 * 0x12 + 6);
  auVar94 = vpmovsxbd_avx2(auVar10);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar69 * 0x13 + 6);
  auVar96 = vpmovsxbd_avx2(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar69 * 0x14 + 6);
  auVar87 = vpmovsxbd_avx2(auVar12);
  auVar99 = vcvtdq2ps_avx(auVar96);
  auVar95 = vcvtdq2ps_avx(auVar87);
  auVar169._4_4_ = fVar130;
  auVar169._0_4_ = fVar130;
  auVar169._8_4_ = fVar130;
  auVar169._12_4_ = fVar130;
  auVar169._16_4_ = fVar130;
  auVar169._20_4_ = fVar130;
  auVar169._24_4_ = fVar130;
  auVar169._28_4_ = fVar130;
  auVar172._8_4_ = 1;
  auVar172._0_8_ = 0x100000001;
  auVar172._12_4_ = 1;
  auVar172._16_4_ = 1;
  auVar172._20_4_ = 1;
  auVar172._24_4_ = 1;
  auVar172._28_4_ = 1;
  auVar98 = ZEXT1632(CONCAT412(fVar156 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar156 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar156 * (ray->dir).field_0.m128[1],fVar130))));
  auVar97 = vpermps_avx2(auVar172,auVar98);
  auVar85 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar86 = vpermps_avx512vl(auVar85,auVar98);
  fVar130 = auVar86._0_4_;
  fVar134 = auVar86._4_4_;
  auVar98._4_4_ = fVar134 * auVar89._4_4_;
  auVar98._0_4_ = fVar130 * auVar89._0_4_;
  fVar135 = auVar86._8_4_;
  auVar98._8_4_ = fVar135 * auVar89._8_4_;
  fVar136 = auVar86._12_4_;
  auVar98._12_4_ = fVar136 * auVar89._12_4_;
  fVar158 = auVar86._16_4_;
  auVar98._16_4_ = fVar158 * auVar89._16_4_;
  fVar159 = auVar86._20_4_;
  auVar98._20_4_ = fVar159 * auVar89._20_4_;
  fVar160 = auVar86._24_4_;
  auVar98._24_4_ = fVar160 * auVar89._24_4_;
  auVar98._28_4_ = auVar87._28_4_;
  auVar87._4_4_ = auVar93._4_4_ * fVar134;
  auVar87._0_4_ = auVar93._0_4_ * fVar130;
  auVar87._8_4_ = auVar93._8_4_ * fVar135;
  auVar87._12_4_ = auVar93._12_4_ * fVar136;
  auVar87._16_4_ = auVar93._16_4_ * fVar158;
  auVar87._20_4_ = auVar93._20_4_ * fVar159;
  auVar87._24_4_ = auVar93._24_4_ * fVar160;
  auVar87._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = auVar95._4_4_ * fVar134;
  auVar96._0_4_ = auVar95._0_4_ * fVar130;
  auVar96._8_4_ = auVar95._8_4_ * fVar135;
  auVar96._12_4_ = auVar95._12_4_ * fVar136;
  auVar96._16_4_ = auVar95._16_4_ * fVar158;
  auVar96._20_4_ = auVar95._20_4_ * fVar159;
  auVar96._24_4_ = auVar95._24_4_ * fVar160;
  auVar96._28_4_ = auVar86._28_4_;
  auVar81 = vfmadd231ps_fma(auVar98,auVar97,auVar88);
  auVar79 = vfmadd231ps_fma(auVar87,auVar97,auVar92);
  auVar6 = vfmadd231ps_fma(auVar96,auVar99,auVar97);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar169,auVar91);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar169,auVar90);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar94,auVar169);
  auVar170._4_4_ = fVar140;
  auVar170._0_4_ = fVar140;
  auVar170._8_4_ = fVar140;
  auVar170._12_4_ = fVar140;
  auVar170._16_4_ = fVar140;
  auVar170._20_4_ = fVar140;
  auVar170._24_4_ = fVar140;
  auVar170._28_4_ = fVar140;
  auVar87 = ZEXT1632(CONCAT412(fVar156 * auVar137._12_4_,
                               CONCAT48(fVar156 * auVar137._8_4_,
                                        CONCAT44(fVar156 * auVar137._4_4_,fVar140))));
  auVar96 = vpermps_avx2(auVar172,auVar87);
  auVar87 = vpermps_avx512vl(auVar85,auVar87);
  fVar156 = auVar87._0_4_;
  fVar130 = auVar87._4_4_;
  auVar97._4_4_ = fVar130 * auVar89._4_4_;
  auVar97._0_4_ = fVar156 * auVar89._0_4_;
  fVar134 = auVar87._8_4_;
  auVar97._8_4_ = fVar134 * auVar89._8_4_;
  fVar135 = auVar87._12_4_;
  auVar97._12_4_ = fVar135 * auVar89._12_4_;
  fVar136 = auVar87._16_4_;
  auVar97._16_4_ = fVar136 * auVar89._16_4_;
  fVar158 = auVar87._20_4_;
  auVar97._20_4_ = fVar158 * auVar89._20_4_;
  fVar159 = auVar87._24_4_;
  auVar97._24_4_ = fVar159 * auVar89._24_4_;
  auVar97._28_4_ = 1;
  auVar85._4_4_ = auVar93._4_4_ * fVar130;
  auVar85._0_4_ = auVar93._0_4_ * fVar156;
  auVar85._8_4_ = auVar93._8_4_ * fVar134;
  auVar85._12_4_ = auVar93._12_4_ * fVar135;
  auVar85._16_4_ = auVar93._16_4_ * fVar136;
  auVar85._20_4_ = auVar93._20_4_ * fVar158;
  auVar85._24_4_ = auVar93._24_4_ * fVar159;
  auVar85._28_4_ = auVar89._28_4_;
  auVar93._4_4_ = auVar95._4_4_ * fVar130;
  auVar93._0_4_ = auVar95._0_4_ * fVar156;
  auVar93._8_4_ = auVar95._8_4_ * fVar134;
  auVar93._12_4_ = auVar95._12_4_ * fVar135;
  auVar93._16_4_ = auVar95._16_4_ * fVar136;
  auVar93._20_4_ = auVar95._20_4_ * fVar158;
  auVar93._24_4_ = auVar95._24_4_ * fVar159;
  auVar93._28_4_ = auVar87._28_4_;
  auVar7 = vfmadd231ps_fma(auVar97,auVar96,auVar88);
  auVar8 = vfmadd231ps_fma(auVar85,auVar96,auVar92);
  auVar9 = vfmadd231ps_fma(auVar93,auVar96,auVar99);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar170,auVar91);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar170,auVar90);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar170,auVar94);
  auVar161._8_4_ = 0x7fffffff;
  auVar161._0_8_ = 0x7fffffff7fffffff;
  auVar161._12_4_ = 0x7fffffff;
  auVar161._16_4_ = 0x7fffffff;
  auVar161._20_4_ = 0x7fffffff;
  auVar161._24_4_ = 0x7fffffff;
  auVar161._28_4_ = 0x7fffffff;
  auVar91 = vandps_avx(ZEXT1632(auVar81),auVar161);
  auVar157._8_4_ = 0x219392ef;
  auVar157._0_8_ = 0x219392ef219392ef;
  auVar157._12_4_ = 0x219392ef;
  auVar157._16_4_ = 0x219392ef;
  auVar157._20_4_ = 0x219392ef;
  auVar157._24_4_ = 0x219392ef;
  auVar157._28_4_ = 0x219392ef;
  uVar74 = vcmpps_avx512vl(auVar91,auVar157,1);
  bVar72 = (bool)((byte)uVar74 & 1);
  auVar86._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar81._0_4_;
  bVar72 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar81._4_4_;
  bVar72 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar81._8_4_;
  bVar72 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar81._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar91 = vandps_avx(ZEXT1632(auVar79),auVar161);
  uVar74 = vcmpps_avx512vl(auVar91,auVar157,1);
  bVar72 = (bool)((byte)uVar74 & 1);
  auVar110._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar79._0_4_;
  bVar72 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar110._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar79._4_4_;
  bVar72 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar110._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar79._8_4_;
  bVar72 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar110._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar79._12_4_;
  auVar110._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar110._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar110._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar110._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar91 = vandps_avx(ZEXT1632(auVar6),auVar161);
  uVar74 = vcmpps_avx512vl(auVar91,auVar157,1);
  bVar72 = (bool)((byte)uVar74 & 1);
  auVar91._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar6._0_4_;
  bVar72 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar6._4_4_;
  bVar72 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar6._8_4_;
  bVar72 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar6._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar74 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar74 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar74 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar74 >> 7) * 0x219392ef;
  auVar88 = vrcp14ps_avx512vl(auVar86);
  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar90 = vfnmadd213ps_avx512vl(auVar86,auVar88,auVar89);
  auVar81 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar110);
  auVar90 = vfnmadd213ps_avx512vl(auVar110,auVar88,auVar89);
  auVar79 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar91);
  auVar91 = vfnmadd213ps_avx512vl(auVar91,auVar88,auVar89);
  auVar6 = vfmadd132ps_fma(auVar91,auVar88,auVar88);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 7 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar7));
  auVar94._4_4_ = auVar81._4_4_ * auVar91._4_4_;
  auVar94._0_4_ = auVar81._0_4_ * auVar91._0_4_;
  auVar94._8_4_ = auVar81._8_4_ * auVar91._8_4_;
  auVar94._12_4_ = auVar81._12_4_ * auVar91._12_4_;
  auVar94._16_4_ = auVar91._16_4_ * 0.0;
  auVar94._20_4_ = auVar91._20_4_ * 0.0;
  auVar94._24_4_ = auVar91._24_4_ * 0.0;
  auVar94._28_4_ = auVar91._28_4_;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 9 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar7));
  auVar113._0_4_ = auVar81._0_4_ * auVar91._0_4_;
  auVar113._4_4_ = auVar81._4_4_ * auVar91._4_4_;
  auVar113._8_4_ = auVar81._8_4_ * auVar91._8_4_;
  auVar113._12_4_ = auVar81._12_4_ * auVar91._12_4_;
  auVar113._16_4_ = auVar91._16_4_ * 0.0;
  auVar113._20_4_ = auVar91._20_4_ * 0.0;
  auVar113._24_4_ = auVar91._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0xe + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar8));
  auVar99._4_4_ = auVar79._4_4_ * auVar91._4_4_;
  auVar99._0_4_ = auVar79._0_4_ * auVar91._0_4_;
  auVar99._8_4_ = auVar79._8_4_ * auVar91._8_4_;
  auVar99._12_4_ = auVar79._12_4_ * auVar91._12_4_;
  auVar99._16_4_ = auVar91._16_4_ * 0.0;
  auVar99._20_4_ = auVar91._20_4_ * 0.0;
  auVar99._24_4_ = auVar91._24_4_ * 0.0;
  auVar99._28_4_ = auVar91._28_4_;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar8));
  auVar112._0_4_ = auVar79._0_4_ * auVar91._0_4_;
  auVar112._4_4_ = auVar79._4_4_ * auVar91._4_4_;
  auVar112._8_4_ = auVar79._8_4_ * auVar91._8_4_;
  auVar112._12_4_ = auVar79._12_4_ * auVar91._12_4_;
  auVar112._16_4_ = auVar91._16_4_ * 0.0;
  auVar112._20_4_ = auVar91._20_4_ * 0.0;
  auVar112._24_4_ = auVar91._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x15 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar9));
  auVar95._4_4_ = auVar91._4_4_ * auVar6._4_4_;
  auVar95._0_4_ = auVar91._0_4_ * auVar6._0_4_;
  auVar95._8_4_ = auVar91._8_4_ * auVar6._8_4_;
  auVar95._12_4_ = auVar91._12_4_ * auVar6._12_4_;
  auVar95._16_4_ = auVar91._16_4_ * 0.0;
  auVar95._20_4_ = auVar91._20_4_ * 0.0;
  auVar95._24_4_ = auVar91._24_4_ * 0.0;
  auVar95._28_4_ = auVar91._28_4_;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x17 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar9));
  auVar111._0_4_ = auVar6._0_4_ * auVar91._0_4_;
  auVar111._4_4_ = auVar6._4_4_ * auVar91._4_4_;
  auVar111._8_4_ = auVar6._8_4_ * auVar91._8_4_;
  auVar111._12_4_ = auVar6._12_4_ * auVar91._12_4_;
  auVar111._16_4_ = auVar91._16_4_ * 0.0;
  auVar111._20_4_ = auVar91._20_4_ * 0.0;
  auVar111._24_4_ = auVar91._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar91 = vpminsd_avx2(auVar94,auVar113);
  auVar88 = vpminsd_avx2(auVar99,auVar112);
  auVar91 = vmaxps_avx(auVar91,auVar88);
  auVar88 = vpminsd_avx2(auVar95,auVar111);
  uVar131 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar89._4_4_ = uVar131;
  auVar89._0_4_ = uVar131;
  auVar89._8_4_ = uVar131;
  auVar89._12_4_ = uVar131;
  auVar89._16_4_ = uVar131;
  auVar89._20_4_ = uVar131;
  auVar89._24_4_ = uVar131;
  auVar89._28_4_ = uVar131;
  auVar88 = vmaxps_avx512vl(auVar88,auVar89);
  auVar91 = vmaxps_avx(auVar91,auVar88);
  auVar88._8_4_ = 0x3f7ffffa;
  auVar88._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar88._12_4_ = 0x3f7ffffa;
  auVar88._16_4_ = 0x3f7ffffa;
  auVar88._20_4_ = 0x3f7ffffa;
  auVar88._24_4_ = 0x3f7ffffa;
  auVar88._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar91,auVar88);
  auVar91 = vpmaxsd_avx2(auVar94,auVar113);
  auVar88 = vpmaxsd_avx2(auVar99,auVar112);
  auVar91 = vminps_avx(auVar91,auVar88);
  auVar88 = vpmaxsd_avx2(auVar95,auVar111);
  fVar156 = ray->tfar;
  auVar90._4_4_ = fVar156;
  auVar90._0_4_ = fVar156;
  auVar90._8_4_ = fVar156;
  auVar90._12_4_ = fVar156;
  auVar90._16_4_ = fVar156;
  auVar90._20_4_ = fVar156;
  auVar90._24_4_ = fVar156;
  auVar90._28_4_ = fVar156;
  auVar88 = vminps_avx512vl(auVar88,auVar90);
  auVar91 = vminps_avx(auVar91,auVar88);
  auVar92._8_4_ = 0x3f800003;
  auVar92._0_8_ = 0x3f8000033f800003;
  auVar92._12_4_ = 0x3f800003;
  auVar92._16_4_ = 0x3f800003;
  auVar92._20_4_ = 0x3f800003;
  auVar92._24_4_ = 0x3f800003;
  auVar92._28_4_ = 0x3f800003;
  auVar91 = vmulps_avx512vl(auVar91,auVar92);
  auVar88 = vpbroadcastd_avx512vl();
  uVar23 = vcmpps_avx512vl(local_80,auVar91,2);
  uVar24 = vpcmpgtd_avx512vl(auVar88,_DAT_01fb4ba0);
  local_530 = ray;
  local_538 = prim;
  for (uVar74 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar23 & (byte)uVar24));
      uVar74 != 0; uVar74 = (ulong)((uint)uVar74 & (uint)uVar74 + 0xff & (uint)uVar23)) {
    lVar71 = 0;
    for (uVar69 = uVar74; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
      lVar71 = lVar71 + 1;
    }
    local_528 = (ulong)*(uint *)(local_538 + 2);
    pGVar14 = (context->scene->geometries).items[*(uint *)(local_538 + 2)].ptr;
    local_488 = (ulong)*(uint *)(local_538 + lVar71 * 4 + 6);
    lVar15 = *(long *)&pGVar14[1].time_range.upper;
    uVar69 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                             (ulong)*(uint *)(local_538 + lVar71 * 4 + 6) *
                             pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    lVar71 = (long)pGVar14[1].intersectionFilterN * uVar69;
    local_430 = *(undefined1 (*) [16])(lVar15 + lVar71);
    lVar73 = (long)pGVar14[1].intersectionFilterN * (uVar69 + 1);
    _local_310 = *(undefined1 (*) [16])(lVar15 + lVar73);
    iVar13 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar137._8_4_ = 0xbeaaaaab;
    auVar137._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar137._12_4_ = 0xbeaaaaab;
    local_440 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                  (pGVar14[2].intersectionFilterN +
                                  uVar69 * (long)pGVar14[2].pointQueryFunc),local_430,auVar137);
    local_450 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                 (pGVar14[2].intersectionFilterN +
                                 (long)pGVar14[2].pointQueryFunc * (uVar69 + 1)),_local_310,auVar137
                               );
    aVar3 = (local_530->org).field_0;
    auVar141 = local_430;
    auVar79 = vsubps_avx(local_430,(undefined1  [16])aVar3);
    uVar131 = auVar79._0_4_;
    auVar80._4_4_ = uVar131;
    auVar80._0_4_ = uVar131;
    auVar80._8_4_ = uVar131;
    auVar80._12_4_ = uVar131;
    auVar81 = vshufps_avx(auVar79,auVar79,0x55);
    aVar4 = (local_510->ray_space).vx.field_0;
    aVar5 = (local_510->ray_space).vy.field_0;
    fVar156 = (local_510->ray_space).vz.field_0.m128[0];
    fVar130 = (local_510->ray_space).vz.field_0.m128[1];
    fVar134 = (local_510->ray_space).vz.field_0.m128[2];
    fVar135 = (local_510->ray_space).vz.field_0.m128[3];
    auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
    auVar163._0_4_ = auVar79._0_4_ * fVar156;
    auVar163._4_4_ = auVar79._4_4_ * fVar130;
    auVar163._8_4_ = auVar79._8_4_ * fVar134;
    auVar163._12_4_ = auVar79._12_4_ * fVar135;
    auVar81 = vfmadd231ps_fma(auVar163,(undefined1  [16])aVar5,auVar81);
    auVar6 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar80);
    auVar79 = vsubps_avx(local_440,(undefined1  [16])aVar3);
    uVar131 = auVar79._0_4_;
    auVar138._4_4_ = uVar131;
    auVar138._0_4_ = uVar131;
    auVar138._8_4_ = uVar131;
    auVar138._12_4_ = uVar131;
    auVar81 = vshufps_avx(auVar79,auVar79,0x55);
    auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
    auVar84._0_4_ = auVar79._0_4_ * fVar156;
    auVar84._4_4_ = auVar79._4_4_ * fVar130;
    auVar84._8_4_ = auVar79._8_4_ * fVar134;
    auVar84._12_4_ = auVar79._12_4_ * fVar135;
    auVar81 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar5,auVar81);
    auVar7 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar138);
    auVar79 = vsubps_avx(local_450,(undefined1  [16])aVar3);
    uVar131 = auVar79._0_4_;
    auVar82._4_4_ = uVar131;
    auVar82._0_4_ = uVar131;
    auVar82._8_4_ = uVar131;
    auVar82._12_4_ = uVar131;
    auVar81 = vshufps_avx(auVar79,auVar79,0x55);
    auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
    auVar165._0_4_ = auVar79._0_4_ * fVar156;
    auVar165._4_4_ = auVar79._4_4_ * fVar130;
    auVar165._8_4_ = auVar79._8_4_ * fVar134;
    auVar165._12_4_ = auVar79._12_4_ * fVar135;
    auVar81 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar5,auVar81);
    auVar8 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar82);
    local_2e0 = ZEXT1632((undefined1  [16])aVar3);
    auVar79 = vsubps_avx(_local_310,(undefined1  [16])aVar3);
    uVar131 = auVar79._0_4_;
    auVar83._4_4_ = uVar131;
    auVar83._0_4_ = uVar131;
    auVar83._8_4_ = uVar131;
    auVar83._12_4_ = uVar131;
    auVar81 = vshufps_avx(auVar79,auVar79,0x55);
    auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
    auVar166._0_4_ = auVar79._0_4_ * fVar156;
    auVar166._4_4_ = auVar79._4_4_ * fVar130;
    auVar166._8_4_ = auVar79._8_4_ * fVar134;
    auVar166._12_4_ = auVar79._12_4_ * fVar135;
    auVar81 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar5,auVar81);
    auVar9 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar4,auVar83);
    local_540 = (long)iVar13;
    lVar75 = local_540 * 0x44;
    auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar75);
    uVar131 = auVar6._0_4_;
    local_340._4_4_ = uVar131;
    local_340._0_4_ = uVar131;
    local_340._8_4_ = uVar131;
    local_340._12_4_ = uVar131;
    local_340._16_4_ = uVar131;
    local_340._20_4_ = uVar131;
    local_340._24_4_ = uVar131;
    local_340._28_4_ = uVar131;
    auVar132._8_4_ = 1;
    auVar132._0_8_ = 0x100000001;
    auVar132._12_4_ = 1;
    auVar132._16_4_ = 1;
    auVar132._20_4_ = 1;
    auVar132._24_4_ = 1;
    auVar132._28_4_ = 1;
    local_360 = vpermps_avx2(auVar132,ZEXT1632(auVar6));
    auVar88 = *(undefined1 (*) [32])(bezier_basis0 + lVar75 + 0x484);
    local_3c0 = vbroadcastss_avx512vl(auVar7);
    auVar89 = *(undefined1 (*) [32])(bezier_basis0 + lVar75 + 0x908);
    local_380 = vpermps_avx512vl(auVar132,ZEXT1632(auVar7));
    local_3e0 = vbroadcastss_avx512vl(auVar8);
    local_480 = vpermps_avx512vl(auVar132,ZEXT1632(auVar8));
    auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar75 + 0xd8c);
    uVar131 = auVar9._0_4_;
    local_400._4_4_ = uVar131;
    local_400._0_4_ = uVar131;
    local_400._8_4_ = uVar131;
    local_400._12_4_ = uVar131;
    local_400._16_4_ = uVar131;
    local_400._20_4_ = uVar131;
    local_400._24_4_ = uVar131;
    local_400._28_4_ = uVar131;
    local_420 = vpermps_avx512vl(auVar132,ZEXT1632(auVar9));
    auVar92 = vmulps_avx512vl(local_400,auVar90);
    auVar93 = vmulps_avx512vl(local_420,auVar90);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,local_3e0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_480);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,local_3c0);
    auVar94 = vfmadd231ps_avx512vl(auVar93,auVar88,local_380);
    auVar10 = vfmadd231ps_fma(auVar92,auVar91,local_340);
    auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar75);
    auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar75 + 0x484);
    auVar11 = vfmadd231ps_fma(auVar94,auVar91,local_360);
    auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar75 + 0x908);
    auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar75 + 0xd8c);
    auVar95 = vmulps_avx512vl(local_400,auVar99);
    auVar184 = ZEXT3264(local_420);
    auVar96 = vmulps_avx512vl(local_420,auVar99);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar94,local_3e0);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,local_480);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,local_3c0);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_380);
    auVar12 = vfmadd231ps_fma(auVar95,auVar92,local_340);
    auVar137 = vfmadd231ps_fma(auVar96,auVar92,local_360);
    auVar95 = vsubps_avx512vl(ZEXT1632(auVar12),ZEXT1632(auVar10));
    auVar96 = vsubps_avx512vl(ZEXT1632(auVar137),ZEXT1632(auVar11));
    auVar87 = vmulps_avx512vl(ZEXT1632(auVar11),auVar95);
    auVar97 = vmulps_avx512vl(ZEXT1632(auVar10),auVar96);
    auVar87 = vsubps_avx512vl(auVar87,auVar97);
    auVar81 = vshufps_avx(local_440,local_440,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar81);
    auVar81 = vshufps_avx(local_450,local_450,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar81);
    _local_e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar15 + 0xc + lVar73)));
    auVar97 = vmulps_avx512vl(_local_e0,auVar90);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar89,local_c0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar88,local_a0);
    local_100 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar15 + 0xc + lVar71)));
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar91,local_100);
    auVar98 = vmulps_avx512vl(_local_e0,auVar99);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_c0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_a0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar92,local_100);
    auVar85 = vmulps_avx512vl(auVar96,auVar96);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar95,auVar95);
    auVar86 = vmaxps_avx512vl(auVar97,auVar98);
    auVar86 = vmulps_avx512vl(auVar86,auVar86);
    auVar85 = vmulps_avx512vl(auVar86,auVar85);
    auVar87 = vmulps_avx512vl(auVar87,auVar87);
    uVar23 = vcmpps_avx512vl(auVar87,auVar85,2);
    auVar81 = vinsertps_avx512f(auVar6,local_100._0_16_,0x30);
    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar80 = vandps_avx512vl(auVar81,auVar79);
    auVar138 = local_440;
    auVar81 = vblendps_avx(auVar7,local_440,8);
    auVar81 = vandps_avx512vl(auVar81,auVar79);
    auVar82 = vmaxps_avx512vl(auVar80,auVar81);
    auVar80 = local_450;
    auVar81 = vblendps_avx(auVar8,local_450,8);
    auVar83 = vandps_avx512vl(auVar81,auVar79);
    auVar81 = vinsertps_avx512f(auVar9,local_e0._0_16_,0x30);
    auVar81 = vandps_avx512vl(auVar81,auVar79);
    auVar81 = vmaxps_avx512vl(auVar83,auVar81);
    auVar81 = vmaxps_avx(auVar82,auVar81);
    auVar79 = vmovshdup_avx(auVar81);
    auVar79 = vmaxss_avx(auVar79,auVar81);
    auVar81 = vshufpd_avx(auVar81,auVar81,1);
    auVar81 = vmaxss_avx(auVar81,auVar79);
    local_300._0_4_ = (undefined4)iVar13;
    register0x00001544 = auVar6._4_12_;
    auVar171._4_4_ = local_300._0_4_;
    auVar171._0_4_ = local_300._0_4_;
    auVar171._8_4_ = local_300._0_4_;
    auVar171._12_4_ = local_300._0_4_;
    auVar171._16_4_ = local_300._0_4_;
    auVar171._20_4_ = local_300._0_4_;
    auVar171._24_4_ = local_300._0_4_;
    auVar171._28_4_ = local_300._0_4_;
    uVar24 = vcmpps_avx512vl(auVar171,_DAT_01f7b060,0xe);
    bVar76 = (byte)uVar23 & (byte)uVar24;
    auVar81 = vmulss_avx512f(auVar81,ZEXT416(0x35000000));
    auVar168._8_4_ = 2;
    auVar168._0_8_ = 0x200000002;
    auVar168._12_4_ = 2;
    auVar168._16_4_ = 2;
    auVar168._20_4_ = 2;
    auVar168._24_4_ = 2;
    auVar168._28_4_ = 2;
    local_3a0 = vpermps_avx512vl(auVar168,ZEXT1632(auVar6));
    auVar185 = ZEXT3264(local_3a0);
    local_120 = vpermps_avx512vl(auVar168,ZEXT1632(auVar7));
    local_140 = vpermps_avx512vl(auVar168,ZEXT1632(auVar8));
    local_160 = vpermps_avx512vl(auVar168,ZEXT1632(auVar9));
    local_2a0 = auVar81._0_4_;
    uStack_29c = auVar81._4_4_;
    uStack_298 = auVar81._8_4_;
    uStack_294 = auVar81._12_4_;
    if (bVar76 == 0) {
      bVar72 = false;
      auVar81 = vxorps_avx512vl(auVar99._0_16_,auVar99._0_16_);
      auVar178 = ZEXT1664(auVar81);
      auVar176 = ZEXT3264(local_340);
      auVar179 = ZEXT3264(local_360);
      auVar180 = ZEXT3264(local_3c0);
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar183 = ZEXT3264(auVar91);
      auVar182 = ZEXT3264(local_380);
      auVar181 = ZEXT3264(local_3e0);
      auVar186 = ZEXT3264(local_480);
      auVar177 = ZEXT3264(local_400);
      local_450 = auVar80;
      local_440 = auVar138;
      local_430 = auVar141;
    }
    else {
      auVar99 = vmulps_avx512vl(local_160,auVar99);
      auVar94 = vfmadd213ps_avx512vl(auVar94,local_140,auVar99);
      auVar93 = vfmadd213ps_avx512vl(auVar93,local_120,auVar94);
      auVar93 = vfmadd213ps_avx512vl(auVar92,local_3a0,auVar93);
      auVar90 = vmulps_avx512vl(local_160,auVar90);
      auVar89 = vfmadd213ps_avx512vl(auVar89,local_140,auVar90);
      auVar94 = vfmadd213ps_avx512vl(auVar88,local_120,auVar89);
      auVar88 = *(undefined1 (*) [32])(bezier_basis0 + lVar75 + 0x1210);
      auVar89 = *(undefined1 (*) [32])(bezier_basis0 + lVar75 + 0x1694);
      auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar75 + 0x1b18);
      auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar75 + 0x1f9c);
      auVar94 = vfmadd213ps_avx512vl(auVar91,local_3a0,auVar94);
      auVar91 = vmulps_avx512vl(local_400,auVar92);
      auVar99 = vmulps_avx512vl(local_420,auVar92);
      auVar92 = vmulps_avx512vl(local_160,auVar92);
      auVar79 = vfmadd231ps_fma(auVar91,auVar90,local_3e0);
      auVar91 = vfmadd231ps_avx512vl(auVar99,auVar90,local_480);
      auVar90 = vfmadd231ps_avx512vl(auVar92,local_140,auVar90);
      auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar89,local_3c0);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar89,local_380);
      auVar99 = vfmadd231ps_avx512vl(auVar90,local_120,auVar89);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,local_340);
      auVar87 = vfmadd231ps_avx512vl(auVar91,auVar88,local_360);
      auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar75 + 0x1210);
      auVar89 = *(undefined1 (*) [32])(bezier_basis1 + lVar75 + 0x1b18);
      auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar75 + 0x1f9c);
      auVar99 = vfmadd231ps_avx512vl(auVar99,local_3a0,auVar88);
      auVar88 = vmulps_avx512vl(local_400,auVar90);
      auVar85 = vmulps_avx512vl(local_420,auVar90);
      auVar90 = vmulps_avx512vl(local_160,auVar90);
      auVar86 = vfmadd231ps_avx512vl(auVar88,auVar89,local_3e0);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar89,local_480);
      auVar89 = vfmadd231ps_avx512vl(auVar90,local_140,auVar89);
      auVar88 = *(undefined1 (*) [32])(bezier_basis1 + lVar75 + 0x1694);
      auVar90 = vfmadd231ps_avx512vl(auVar86,auVar88,local_3c0);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar88,local_380);
      auVar88 = vfmadd231ps_avx512vl(auVar89,local_120,auVar88);
      auVar89 = vfmadd231ps_avx512vl(auVar90,auVar91,local_340);
      auVar90 = vfmadd231ps_avx512vl(auVar85,auVar91,local_360);
      auVar85 = vfmadd231ps_avx512vl(auVar88,local_3a0,auVar91);
      auVar173._8_4_ = 0x7fffffff;
      auVar173._0_8_ = 0x7fffffff7fffffff;
      auVar173._12_4_ = 0x7fffffff;
      auVar173._16_4_ = 0x7fffffff;
      auVar173._20_4_ = 0x7fffffff;
      auVar173._24_4_ = 0x7fffffff;
      auVar173._28_4_ = 0x7fffffff;
      auVar91 = vandps_avx(auVar92,auVar173);
      auVar88 = vandps_avx(auVar87,auVar173);
      auVar88 = vmaxps_avx(auVar91,auVar88);
      auVar91 = vandps_avx(auVar99,auVar173);
      auVar91 = vmaxps_avx(auVar88,auVar91);
      auVar99 = vbroadcastss_avx512vl(auVar81);
      uVar69 = vcmpps_avx512vl(auVar91,auVar99,1);
      bVar72 = (bool)((byte)uVar69 & 1);
      auVar100._0_4_ = (float)((uint)bVar72 * auVar95._0_4_ | (uint)!bVar72 * auVar92._0_4_);
      bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar100._4_4_ = (float)((uint)bVar72 * auVar95._4_4_ | (uint)!bVar72 * auVar92._4_4_);
      bVar72 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar100._8_4_ = (float)((uint)bVar72 * auVar95._8_4_ | (uint)!bVar72 * auVar92._8_4_);
      bVar72 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar100._12_4_ = (float)((uint)bVar72 * auVar95._12_4_ | (uint)!bVar72 * auVar92._12_4_);
      bVar72 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar100._16_4_ = (float)((uint)bVar72 * auVar95._16_4_ | (uint)!bVar72 * auVar92._16_4_);
      bVar72 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar100._20_4_ = (float)((uint)bVar72 * auVar95._20_4_ | (uint)!bVar72 * auVar92._20_4_);
      bVar72 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar100._24_4_ = (float)((uint)bVar72 * auVar95._24_4_ | (uint)!bVar72 * auVar92._24_4_);
      bVar72 = SUB81(uVar69 >> 7,0);
      auVar100._28_4_ = (uint)bVar72 * auVar95._28_4_ | (uint)!bVar72 * auVar92._28_4_;
      bVar72 = (bool)((byte)uVar69 & 1);
      auVar101._0_4_ = (float)((uint)bVar72 * auVar96._0_4_ | (uint)!bVar72 * auVar87._0_4_);
      bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar101._4_4_ = (float)((uint)bVar72 * auVar96._4_4_ | (uint)!bVar72 * auVar87._4_4_);
      bVar72 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar101._8_4_ = (float)((uint)bVar72 * auVar96._8_4_ | (uint)!bVar72 * auVar87._8_4_);
      bVar72 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar101._12_4_ = (float)((uint)bVar72 * auVar96._12_4_ | (uint)!bVar72 * auVar87._12_4_);
      bVar72 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar101._16_4_ = (float)((uint)bVar72 * auVar96._16_4_ | (uint)!bVar72 * auVar87._16_4_);
      bVar72 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar101._20_4_ = (float)((uint)bVar72 * auVar96._20_4_ | (uint)!bVar72 * auVar87._20_4_);
      bVar72 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar101._24_4_ = (float)((uint)bVar72 * auVar96._24_4_ | (uint)!bVar72 * auVar87._24_4_);
      bVar72 = SUB81(uVar69 >> 7,0);
      auVar101._28_4_ = (uint)bVar72 * auVar96._28_4_ | (uint)!bVar72 * auVar87._28_4_;
      vandps_avx512vl(auVar89,auVar173);
      auVar91 = vandps_avx(auVar90,auVar173);
      auVar88 = vmaxps_avx(auVar101,auVar91);
      auVar91 = vandps_avx(auVar85,auVar173);
      auVar91 = vmaxps_avx(auVar88,auVar91);
      uVar69 = vcmpps_avx512vl(auVar91,auVar99,1);
      bVar72 = (bool)((byte)uVar69 & 1);
      auVar102._0_4_ = (uint)bVar72 * auVar95._0_4_ | (uint)!bVar72 * auVar89._0_4_;
      bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar102._4_4_ = (uint)bVar72 * auVar95._4_4_ | (uint)!bVar72 * auVar89._4_4_;
      bVar72 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar102._8_4_ = (uint)bVar72 * auVar95._8_4_ | (uint)!bVar72 * auVar89._8_4_;
      bVar72 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar102._12_4_ = (uint)bVar72 * auVar95._12_4_ | (uint)!bVar72 * auVar89._12_4_;
      bVar72 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar102._16_4_ = (uint)bVar72 * auVar95._16_4_ | (uint)!bVar72 * auVar89._16_4_;
      bVar72 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar102._20_4_ = (uint)bVar72 * auVar95._20_4_ | (uint)!bVar72 * auVar89._20_4_;
      bVar72 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar102._24_4_ = (uint)bVar72 * auVar95._24_4_ | (uint)!bVar72 * auVar89._24_4_;
      bVar72 = SUB81(uVar69 >> 7,0);
      auVar102._28_4_ = (uint)bVar72 * auVar95._28_4_ | (uint)!bVar72 * auVar89._28_4_;
      bVar72 = (bool)((byte)uVar69 & 1);
      auVar103._0_4_ = (float)((uint)bVar72 * auVar96._0_4_ | (uint)!bVar72 * auVar90._0_4_);
      bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar103._4_4_ = (float)((uint)bVar72 * auVar96._4_4_ | (uint)!bVar72 * auVar90._4_4_);
      bVar72 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar103._8_4_ = (float)((uint)bVar72 * auVar96._8_4_ | (uint)!bVar72 * auVar90._8_4_);
      bVar72 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar103._12_4_ = (float)((uint)bVar72 * auVar96._12_4_ | (uint)!bVar72 * auVar90._12_4_);
      bVar72 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar103._16_4_ = (float)((uint)bVar72 * auVar96._16_4_ | (uint)!bVar72 * auVar90._16_4_);
      bVar72 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar103._20_4_ = (float)((uint)bVar72 * auVar96._20_4_ | (uint)!bVar72 * auVar90._20_4_);
      bVar72 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar103._24_4_ = (float)((uint)bVar72 * auVar96._24_4_ | (uint)!bVar72 * auVar90._24_4_);
      bVar72 = SUB81(uVar69 >> 7,0);
      auVar103._28_4_ = (uint)bVar72 * auVar96._28_4_ | (uint)!bVar72 * auVar90._28_4_;
      auVar167._8_4_ = 0x80000000;
      auVar167._0_8_ = 0x8000000080000000;
      auVar167._12_4_ = 0x80000000;
      auVar167._16_4_ = 0x80000000;
      auVar167._20_4_ = 0x80000000;
      auVar167._24_4_ = 0x80000000;
      auVar167._28_4_ = 0x80000000;
      auVar91 = vxorps_avx512vl(auVar102,auVar167);
      auVar84 = vxorps_avx512vl(local_3e0._0_16_,local_3e0._0_16_);
      auVar178 = ZEXT1664(auVar84);
      auVar88 = vfmadd213ps_avx512vl(auVar100,auVar100,ZEXT1632(auVar84));
      auVar81 = vfmadd231ps_fma(auVar88,auVar101,auVar101);
      auVar88 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
      auVar174._8_4_ = 0xbf000000;
      auVar174._0_8_ = 0xbf000000bf000000;
      auVar174._12_4_ = 0xbf000000;
      auVar174._16_4_ = 0xbf000000;
      auVar174._20_4_ = 0xbf000000;
      auVar174._24_4_ = 0xbf000000;
      auVar174._28_4_ = 0xbf000000;
      fVar156 = auVar88._0_4_;
      fVar130 = auVar88._4_4_;
      fVar134 = auVar88._8_4_;
      fVar135 = auVar88._12_4_;
      fVar136 = auVar88._16_4_;
      fVar158 = auVar88._20_4_;
      fVar159 = auVar88._24_4_;
      auVar33._4_4_ = fVar130 * fVar130 * fVar130 * auVar81._4_4_ * -0.5;
      auVar33._0_4_ = fVar156 * fVar156 * fVar156 * auVar81._0_4_ * -0.5;
      auVar33._8_4_ = fVar134 * fVar134 * fVar134 * auVar81._8_4_ * -0.5;
      auVar33._12_4_ = fVar135 * fVar135 * fVar135 * auVar81._12_4_ * -0.5;
      auVar33._16_4_ = fVar136 * fVar136 * fVar136 * -0.0;
      auVar33._20_4_ = fVar158 * fVar158 * fVar158 * -0.0;
      auVar33._24_4_ = fVar159 * fVar159 * fVar159 * -0.0;
      auVar33._28_4_ = 0;
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar90 = vfmadd231ps_avx512vl(auVar33,auVar89,auVar88);
      auVar34._4_4_ = auVar101._4_4_ * auVar90._4_4_;
      auVar34._0_4_ = auVar101._0_4_ * auVar90._0_4_;
      auVar34._8_4_ = auVar101._8_4_ * auVar90._8_4_;
      auVar34._12_4_ = auVar101._12_4_ * auVar90._12_4_;
      auVar34._16_4_ = auVar101._16_4_ * auVar90._16_4_;
      auVar34._20_4_ = auVar101._20_4_ * auVar90._20_4_;
      auVar34._24_4_ = auVar101._24_4_ * auVar90._24_4_;
      auVar34._28_4_ = auVar88._28_4_;
      auVar35._4_4_ = auVar90._4_4_ * -auVar100._4_4_;
      auVar35._0_4_ = auVar90._0_4_ * -auVar100._0_4_;
      auVar35._8_4_ = auVar90._8_4_ * -auVar100._8_4_;
      auVar35._12_4_ = auVar90._12_4_ * -auVar100._12_4_;
      auVar35._16_4_ = auVar90._16_4_ * -auVar100._16_4_;
      auVar35._20_4_ = auVar90._20_4_ * -auVar100._20_4_;
      auVar35._24_4_ = auVar90._24_4_ * -auVar100._24_4_;
      auVar35._28_4_ = auVar100._28_4_ ^ 0x80000000;
      auVar90 = vmulps_avx512vl(auVar90,ZEXT1632(auVar84));
      auVar99 = ZEXT1632(auVar84);
      auVar88 = vfmadd213ps_avx512vl(auVar102,auVar102,auVar99);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar103,auVar103);
      auVar92 = vrsqrt14ps_avx512vl(auVar88);
      auVar88 = vmulps_avx512vl(auVar88,auVar174);
      fVar156 = auVar92._0_4_;
      fVar130 = auVar92._4_4_;
      fVar134 = auVar92._8_4_;
      fVar135 = auVar92._12_4_;
      fVar136 = auVar92._16_4_;
      fVar158 = auVar92._20_4_;
      fVar159 = auVar92._24_4_;
      auVar36._4_4_ = fVar130 * fVar130 * fVar130 * auVar88._4_4_;
      auVar36._0_4_ = fVar156 * fVar156 * fVar156 * auVar88._0_4_;
      auVar36._8_4_ = fVar134 * fVar134 * fVar134 * auVar88._8_4_;
      auVar36._12_4_ = fVar135 * fVar135 * fVar135 * auVar88._12_4_;
      auVar36._16_4_ = fVar136 * fVar136 * fVar136 * auVar88._16_4_;
      auVar36._20_4_ = fVar158 * fVar158 * fVar158 * auVar88._20_4_;
      auVar36._24_4_ = fVar159 * fVar159 * fVar159 * auVar88._24_4_;
      auVar36._28_4_ = 0xbf000000;
      auVar89 = vfmadd231ps_avx512vl(auVar36,auVar89,auVar92);
      auVar37._4_4_ = auVar103._4_4_ * auVar89._4_4_;
      auVar37._0_4_ = auVar103._0_4_ * auVar89._0_4_;
      auVar37._8_4_ = auVar103._8_4_ * auVar89._8_4_;
      auVar37._12_4_ = auVar103._12_4_ * auVar89._12_4_;
      auVar37._16_4_ = auVar103._16_4_ * auVar89._16_4_;
      auVar37._20_4_ = auVar103._20_4_ * auVar89._20_4_;
      auVar37._24_4_ = auVar103._24_4_ * auVar89._24_4_;
      auVar37._28_4_ = auVar92._28_4_;
      auVar38._4_4_ = auVar89._4_4_ * auVar91._4_4_;
      auVar38._0_4_ = auVar89._0_4_ * auVar91._0_4_;
      auVar38._8_4_ = auVar89._8_4_ * auVar91._8_4_;
      auVar38._12_4_ = auVar89._12_4_ * auVar91._12_4_;
      auVar38._16_4_ = auVar89._16_4_ * auVar91._16_4_;
      auVar38._20_4_ = auVar89._20_4_ * auVar91._20_4_;
      auVar38._24_4_ = auVar89._24_4_ * auVar91._24_4_;
      auVar38._28_4_ = auVar88._28_4_;
      auVar91 = vmulps_avx512vl(auVar89,auVar99);
      auVar81 = vfmadd213ps_fma(auVar34,auVar97,ZEXT1632(auVar10));
      auVar79 = vfmadd213ps_fma(auVar35,auVar97,ZEXT1632(auVar11));
      auVar89 = vfmadd213ps_avx512vl(auVar90,auVar97,auVar94);
      auVar92 = vfmadd213ps_avx512vl(auVar37,auVar98,ZEXT1632(auVar12));
      auVar82 = vfnmadd213ps_fma(auVar34,auVar97,ZEXT1632(auVar10));
      auVar6 = vfmadd213ps_fma(auVar38,auVar98,ZEXT1632(auVar137));
      auVar11 = vfnmadd213ps_fma(auVar35,auVar97,ZEXT1632(auVar11));
      auVar7 = vfmadd213ps_fma(auVar91,auVar98,auVar93);
      auVar83 = vfnmadd231ps_fma(auVar94,auVar97,auVar90);
      auVar12 = vfnmadd213ps_fma(auVar37,auVar98,ZEXT1632(auVar12));
      auVar137 = vfnmadd213ps_fma(auVar38,auVar98,ZEXT1632(auVar137));
      auVar163 = vfnmadd231ps_fma(auVar93,auVar98,auVar91);
      auVar93 = vsubps_avx512vl(auVar92,ZEXT1632(auVar82));
      auVar91 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar11));
      auVar88 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar83));
      auVar39._4_4_ = auVar91._4_4_ * auVar83._4_4_;
      auVar39._0_4_ = auVar91._0_4_ * auVar83._0_4_;
      auVar39._8_4_ = auVar91._8_4_ * auVar83._8_4_;
      auVar39._12_4_ = auVar91._12_4_ * auVar83._12_4_;
      auVar39._16_4_ = auVar91._16_4_ * 0.0;
      auVar39._20_4_ = auVar91._20_4_ * 0.0;
      auVar39._24_4_ = auVar91._24_4_ * 0.0;
      auVar39._28_4_ = auVar90._28_4_;
      auVar8 = vfmsub231ps_fma(auVar39,ZEXT1632(auVar11),auVar88);
      auVar40._4_4_ = auVar88._4_4_ * auVar82._4_4_;
      auVar40._0_4_ = auVar88._0_4_ * auVar82._0_4_;
      auVar40._8_4_ = auVar88._8_4_ * auVar82._8_4_;
      auVar40._12_4_ = auVar88._12_4_ * auVar82._12_4_;
      auVar40._16_4_ = auVar88._16_4_ * 0.0;
      auVar40._20_4_ = auVar88._20_4_ * 0.0;
      auVar40._24_4_ = auVar88._24_4_ * 0.0;
      auVar40._28_4_ = auVar88._28_4_;
      auVar9 = vfmsub231ps_fma(auVar40,ZEXT1632(auVar83),auVar93);
      auVar41._4_4_ = auVar11._4_4_ * auVar93._4_4_;
      auVar41._0_4_ = auVar11._0_4_ * auVar93._0_4_;
      auVar41._8_4_ = auVar11._8_4_ * auVar93._8_4_;
      auVar41._12_4_ = auVar11._12_4_ * auVar93._12_4_;
      auVar41._16_4_ = auVar93._16_4_ * 0.0;
      auVar41._20_4_ = auVar93._20_4_ * 0.0;
      auVar41._24_4_ = auVar93._24_4_ * 0.0;
      auVar41._28_4_ = auVar93._28_4_;
      auVar10 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar82),auVar91);
      auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar99,ZEXT1632(auVar9));
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar99,ZEXT1632(auVar8));
      auVar85 = ZEXT1632(auVar84);
      uVar69 = vcmpps_avx512vl(auVar91,auVar85,2);
      bVar68 = (byte)uVar69;
      fVar77 = (float)((uint)(bVar68 & 1) * auVar81._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar12._0_4_);
      bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
      fVar124 = (float)((uint)bVar72 * auVar81._4_4_ | (uint)!bVar72 * auVar12._4_4_);
      bVar72 = (bool)((byte)(uVar69 >> 2) & 1);
      fVar126 = (float)((uint)bVar72 * auVar81._8_4_ | (uint)!bVar72 * auVar12._8_4_);
      bVar72 = (bool)((byte)(uVar69 >> 3) & 1);
      fVar128 = (float)((uint)bVar72 * auVar81._12_4_ | (uint)!bVar72 * auVar12._12_4_);
      auVar94 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar126,CONCAT44(fVar124,fVar77))));
      fVar78 = (float)((uint)(bVar68 & 1) * auVar79._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar137._0_4_);
      bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
      fVar125 = (float)((uint)bVar72 * auVar79._4_4_ | (uint)!bVar72 * auVar137._4_4_);
      bVar72 = (bool)((byte)(uVar69 >> 2) & 1);
      fVar127 = (float)((uint)bVar72 * auVar79._8_4_ | (uint)!bVar72 * auVar137._8_4_);
      bVar72 = (bool)((byte)(uVar69 >> 3) & 1);
      fVar129 = (float)((uint)bVar72 * auVar79._12_4_ | (uint)!bVar72 * auVar137._12_4_);
      auVar99 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar127,CONCAT44(fVar125,fVar78))));
      auVar104._0_4_ =
           (float)((uint)(bVar68 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar163._0_4_);
      bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar104._4_4_ = (float)((uint)bVar72 * auVar89._4_4_ | (uint)!bVar72 * auVar163._4_4_);
      bVar72 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar104._8_4_ = (float)((uint)bVar72 * auVar89._8_4_ | (uint)!bVar72 * auVar163._8_4_);
      bVar72 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar104._12_4_ = (float)((uint)bVar72 * auVar89._12_4_ | (uint)!bVar72 * auVar163._12_4_);
      fVar156 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar89._16_4_);
      auVar104._16_4_ = fVar156;
      fVar130 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar89._20_4_);
      auVar104._20_4_ = fVar130;
      fVar134 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar89._24_4_);
      auVar104._24_4_ = fVar134;
      iVar1 = (uint)(byte)(uVar69 >> 7) * auVar89._28_4_;
      auVar104._28_4_ = iVar1;
      auVar91 = vblendmps_avx512vl(ZEXT1632(auVar82),auVar92);
      auVar105._0_4_ = (uint)(bVar68 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar8._0_4_
      ;
      bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar105._4_4_ = (uint)bVar72 * auVar91._4_4_ | (uint)!bVar72 * auVar8._4_4_;
      bVar72 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar105._8_4_ = (uint)bVar72 * auVar91._8_4_ | (uint)!bVar72 * auVar8._8_4_;
      bVar72 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar105._12_4_ = (uint)bVar72 * auVar91._12_4_ | (uint)!bVar72 * auVar8._12_4_;
      auVar105._16_4_ = (uint)((byte)(uVar69 >> 4) & 1) * auVar91._16_4_;
      auVar105._20_4_ = (uint)((byte)(uVar69 >> 5) & 1) * auVar91._20_4_;
      auVar105._24_4_ = (uint)((byte)(uVar69 >> 6) & 1) * auVar91._24_4_;
      auVar105._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar91._28_4_;
      auVar91 = vblendmps_avx512vl(ZEXT1632(auVar11),ZEXT1632(auVar6));
      auVar106._0_4_ =
           (float)((uint)(bVar68 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar81._0_4_);
      bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar72 * auVar91._4_4_ | (uint)!bVar72 * auVar81._4_4_);
      bVar72 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar72 * auVar91._8_4_ | (uint)!bVar72 * auVar81._8_4_);
      bVar72 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar72 * auVar91._12_4_ | (uint)!bVar72 * auVar81._12_4_);
      fVar136 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar91._16_4_);
      auVar106._16_4_ = fVar136;
      fVar135 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar91._20_4_);
      auVar106._20_4_ = fVar135;
      fVar158 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar91._24_4_);
      auVar106._24_4_ = fVar158;
      auVar106._28_4_ = (uint)(byte)(uVar69 >> 7) * auVar91._28_4_;
      auVar91 = vblendmps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar7));
      auVar107._0_4_ =
           (float)((uint)(bVar68 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar79._0_4_);
      bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar72 * auVar91._4_4_ | (uint)!bVar72 * auVar79._4_4_);
      bVar72 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar72 * auVar91._8_4_ | (uint)!bVar72 * auVar79._8_4_);
      bVar72 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar72 * auVar91._12_4_ | (uint)!bVar72 * auVar79._12_4_);
      fVar140 = (float)((uint)((byte)(uVar69 >> 4) & 1) * auVar91._16_4_);
      auVar107._16_4_ = fVar140;
      fVar160 = (float)((uint)((byte)(uVar69 >> 5) & 1) * auVar91._20_4_);
      auVar107._20_4_ = fVar160;
      fVar159 = (float)((uint)((byte)(uVar69 >> 6) & 1) * auVar91._24_4_);
      auVar107._24_4_ = fVar159;
      iVar2 = (uint)(byte)(uVar69 >> 7) * auVar91._28_4_;
      auVar107._28_4_ = iVar2;
      auVar108._0_4_ =
           (uint)(bVar68 & 1) * (int)auVar82._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar92._0_4_;
      bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar108._4_4_ = (uint)bVar72 * (int)auVar82._4_4_ | (uint)!bVar72 * auVar92._4_4_;
      bVar72 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar108._8_4_ = (uint)bVar72 * (int)auVar82._8_4_ | (uint)!bVar72 * auVar92._8_4_;
      bVar72 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar108._12_4_ = (uint)bVar72 * (int)auVar82._12_4_ | (uint)!bVar72 * auVar92._12_4_;
      auVar108._16_4_ = (uint)!(bool)((byte)(uVar69 >> 4) & 1) * auVar92._16_4_;
      auVar108._20_4_ = (uint)!(bool)((byte)(uVar69 >> 5) & 1) * auVar92._20_4_;
      auVar108._24_4_ = (uint)!(bool)((byte)(uVar69 >> 6) & 1) * auVar92._24_4_;
      auVar108._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar92._28_4_;
      bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
      bVar18 = (bool)((byte)(uVar69 >> 2) & 1);
      bVar20 = (bool)((byte)(uVar69 >> 3) & 1);
      bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
      bVar19 = (bool)((byte)(uVar69 >> 2) & 1);
      bVar21 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar95 = vsubps_avx512vl(auVar108,auVar94);
      auVar88 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar11._12_4_ |
                                              (uint)!bVar20 * auVar6._12_4_,
                                              CONCAT48((uint)bVar18 * (int)auVar11._8_4_ |
                                                       (uint)!bVar18 * auVar6._8_4_,
                                                       CONCAT44((uint)bVar72 * (int)auVar11._4_4_ |
                                                                (uint)!bVar72 * auVar6._4_4_,
                                                                (uint)(bVar68 & 1) *
                                                                (int)auVar11._0_4_ |
                                                                (uint)!(bool)(bVar68 & 1) *
                                                                auVar6._0_4_)))),auVar99);
      auVar89 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar83._12_4_ |
                                              (uint)!bVar21 * auVar7._12_4_,
                                              CONCAT48((uint)bVar19 * (int)auVar83._8_4_ |
                                                       (uint)!bVar19 * auVar7._8_4_,
                                                       CONCAT44((uint)bVar17 * (int)auVar83._4_4_ |
                                                                (uint)!bVar17 * auVar7._4_4_,
                                                                (uint)(bVar68 & 1) *
                                                                (int)auVar83._0_4_ |
                                                                (uint)!(bool)(bVar68 & 1) *
                                                                auVar7._0_4_)))),auVar104);
      auVar90 = vsubps_avx(auVar94,auVar105);
      auVar92 = vsubps_avx(auVar99,auVar106);
      auVar93 = vsubps_avx(auVar104,auVar107);
      auVar42._4_4_ = auVar89._4_4_ * fVar124;
      auVar42._0_4_ = auVar89._0_4_ * fVar77;
      auVar42._8_4_ = auVar89._8_4_ * fVar126;
      auVar42._12_4_ = auVar89._12_4_ * fVar128;
      auVar42._16_4_ = auVar89._16_4_ * 0.0;
      auVar42._20_4_ = auVar89._20_4_ * 0.0;
      auVar42._24_4_ = auVar89._24_4_ * 0.0;
      auVar42._28_4_ = 0;
      auVar81 = vfmsub231ps_fma(auVar42,auVar104,auVar95);
      auVar148._0_4_ = fVar78 * auVar95._0_4_;
      auVar148._4_4_ = fVar125 * auVar95._4_4_;
      auVar148._8_4_ = fVar127 * auVar95._8_4_;
      auVar148._12_4_ = fVar129 * auVar95._12_4_;
      auVar148._16_4_ = auVar95._16_4_ * 0.0;
      auVar148._20_4_ = auVar95._20_4_ * 0.0;
      auVar148._24_4_ = auVar95._24_4_ * 0.0;
      auVar148._28_4_ = 0;
      auVar79 = vfmsub231ps_fma(auVar148,auVar94,auVar88);
      auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar85,ZEXT1632(auVar81));
      auVar150._0_4_ = auVar88._0_4_ * auVar104._0_4_;
      auVar150._4_4_ = auVar88._4_4_ * auVar104._4_4_;
      auVar150._8_4_ = auVar88._8_4_ * auVar104._8_4_;
      auVar150._12_4_ = auVar88._12_4_ * auVar104._12_4_;
      auVar150._16_4_ = auVar88._16_4_ * fVar156;
      auVar150._20_4_ = auVar88._20_4_ * fVar130;
      auVar150._24_4_ = auVar88._24_4_ * fVar134;
      auVar150._28_4_ = 0;
      auVar81 = vfmsub231ps_fma(auVar150,auVar99,auVar89);
      auVar96 = vfmadd231ps_avx512vl(auVar91,auVar85,ZEXT1632(auVar81));
      auVar91 = vmulps_avx512vl(auVar93,auVar105);
      auVar91 = vfmsub231ps_avx512vl(auVar91,auVar90,auVar107);
      auVar43._4_4_ = auVar92._4_4_ * auVar107._4_4_;
      auVar43._0_4_ = auVar92._0_4_ * auVar107._0_4_;
      auVar43._8_4_ = auVar92._8_4_ * auVar107._8_4_;
      auVar43._12_4_ = auVar92._12_4_ * auVar107._12_4_;
      auVar43._16_4_ = auVar92._16_4_ * fVar140;
      auVar43._20_4_ = auVar92._20_4_ * fVar160;
      auVar43._24_4_ = auVar92._24_4_ * fVar159;
      auVar43._28_4_ = iVar2;
      auVar81 = vfmsub231ps_fma(auVar43,auVar106,auVar93);
      auVar151._0_4_ = auVar106._0_4_ * auVar90._0_4_;
      auVar151._4_4_ = auVar106._4_4_ * auVar90._4_4_;
      auVar151._8_4_ = auVar106._8_4_ * auVar90._8_4_;
      auVar151._12_4_ = auVar106._12_4_ * auVar90._12_4_;
      auVar151._16_4_ = fVar136 * auVar90._16_4_;
      auVar151._20_4_ = fVar135 * auVar90._20_4_;
      auVar151._24_4_ = fVar158 * auVar90._24_4_;
      auVar151._28_4_ = 0;
      auVar79 = vfmsub231ps_fma(auVar151,auVar92,auVar105);
      auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar85,auVar91);
      auVar87 = vfmadd231ps_avx512vl(auVar91,auVar85,ZEXT1632(auVar81));
      auVar91 = vmaxps_avx(auVar96,auVar87);
      uVar23 = vcmpps_avx512vl(auVar91,auVar85,2);
      bVar76 = bVar76 & (byte)uVar23;
      auVar176 = ZEXT3264(local_340);
      auVar179 = ZEXT3264(local_360);
      auVar180 = ZEXT3264(local_3c0);
      auVar182 = ZEXT3264(local_380);
      auVar181 = ZEXT3264(local_3e0);
      auVar186 = ZEXT3264(local_480);
      auVar177 = ZEXT3264(local_400);
      auVar184 = ZEXT3264(local_420);
      if (bVar76 == 0) {
        bVar72 = false;
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar183 = ZEXT3264(auVar91);
        auVar185 = ZEXT3264(local_3a0);
        local_450 = auVar80;
        local_440 = auVar138;
        local_430 = auVar141;
      }
      else {
        auVar44._4_4_ = auVar93._4_4_ * auVar88._4_4_;
        auVar44._0_4_ = auVar93._0_4_ * auVar88._0_4_;
        auVar44._8_4_ = auVar93._8_4_ * auVar88._8_4_;
        auVar44._12_4_ = auVar93._12_4_ * auVar88._12_4_;
        auVar44._16_4_ = auVar93._16_4_ * auVar88._16_4_;
        auVar44._20_4_ = auVar93._20_4_ * auVar88._20_4_;
        auVar44._24_4_ = auVar93._24_4_ * auVar88._24_4_;
        auVar44._28_4_ = auVar91._28_4_;
        auVar6 = vfmsub231ps_fma(auVar44,auVar92,auVar89);
        auVar45._4_4_ = auVar89._4_4_ * auVar90._4_4_;
        auVar45._0_4_ = auVar89._0_4_ * auVar90._0_4_;
        auVar45._8_4_ = auVar89._8_4_ * auVar90._8_4_;
        auVar45._12_4_ = auVar89._12_4_ * auVar90._12_4_;
        auVar45._16_4_ = auVar89._16_4_ * auVar90._16_4_;
        auVar45._20_4_ = auVar89._20_4_ * auVar90._20_4_;
        auVar45._24_4_ = auVar89._24_4_ * auVar90._24_4_;
        auVar45._28_4_ = auVar89._28_4_;
        auVar79 = vfmsub231ps_fma(auVar45,auVar95,auVar93);
        auVar46._4_4_ = auVar92._4_4_ * auVar95._4_4_;
        auVar46._0_4_ = auVar92._0_4_ * auVar95._0_4_;
        auVar46._8_4_ = auVar92._8_4_ * auVar95._8_4_;
        auVar46._12_4_ = auVar92._12_4_ * auVar95._12_4_;
        auVar46._16_4_ = auVar92._16_4_ * auVar95._16_4_;
        auVar46._20_4_ = auVar92._20_4_ * auVar95._20_4_;
        auVar46._24_4_ = auVar92._24_4_ * auVar95._24_4_;
        auVar46._28_4_ = auVar92._28_4_;
        auVar7 = vfmsub231ps_fma(auVar46,auVar90,auVar88);
        auVar81 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar79),ZEXT1632(auVar7));
        auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar6),auVar85);
        auVar91 = vrcp14ps_avx512vl(auVar88);
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar183 = ZEXT3264(auVar89);
        auVar90 = vfnmadd213ps_avx512vl(auVar91,auVar88,auVar89);
        auVar81 = vfmadd132ps_fma(auVar90,auVar91,auVar91);
        auVar47._4_4_ = auVar7._4_4_ * auVar104._4_4_;
        auVar47._0_4_ = auVar7._0_4_ * auVar104._0_4_;
        auVar47._8_4_ = auVar7._8_4_ * auVar104._8_4_;
        auVar47._12_4_ = auVar7._12_4_ * auVar104._12_4_;
        auVar47._16_4_ = fVar156 * 0.0;
        auVar47._20_4_ = fVar130 * 0.0;
        auVar47._24_4_ = fVar134 * 0.0;
        auVar47._28_4_ = iVar1;
        auVar79 = vfmadd231ps_fma(auVar47,auVar99,ZEXT1632(auVar79));
        auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar94,ZEXT1632(auVar6));
        fVar130 = auVar81._0_4_;
        fVar134 = auVar81._4_4_;
        fVar135 = auVar81._8_4_;
        fVar136 = auVar81._12_4_;
        local_240 = ZEXT1632(CONCAT412(auVar79._12_4_ * fVar136,
                                       CONCAT48(auVar79._8_4_ * fVar135,
                                                CONCAT44(auVar79._4_4_ * fVar134,
                                                         auVar79._0_4_ * fVar130))));
        auVar162._8_4_ = 3;
        auVar162._0_8_ = 0x300000003;
        auVar162._12_4_ = 3;
        auVar162._16_4_ = 3;
        auVar162._20_4_ = 3;
        auVar162._24_4_ = 3;
        auVar162._28_4_ = 3;
        auVar91 = vpermps_avx2(auVar162,ZEXT1632((undefined1  [16])aVar3));
        uVar23 = vcmpps_avx512vl(auVar91,local_240,2);
        fVar156 = local_530->tfar;
        auVar26._4_4_ = fVar156;
        auVar26._0_4_ = fVar156;
        auVar26._8_4_ = fVar156;
        auVar26._12_4_ = fVar156;
        auVar26._16_4_ = fVar156;
        auVar26._20_4_ = fVar156;
        auVar26._24_4_ = fVar156;
        auVar26._28_4_ = fVar156;
        uVar24 = vcmpps_avx512vl(local_240,auVar26,2);
        bVar76 = (byte)uVar23 & (byte)uVar24 & bVar76;
        auVar185 = ZEXT3264(local_3a0);
        local_450 = auVar80;
        local_440 = auVar138;
        local_430 = auVar141;
        if (bVar76 != 0) {
          uVar23 = vcmpps_avx512vl(auVar88,auVar85,4);
          bVar76 = bVar76 & (byte)uVar23;
          if (bVar76 != 0) {
            fVar156 = auVar96._0_4_ * fVar130;
            fVar158 = auVar96._4_4_ * fVar134;
            auVar48._4_4_ = fVar158;
            auVar48._0_4_ = fVar156;
            fVar159 = auVar96._8_4_ * fVar135;
            auVar48._8_4_ = fVar159;
            fVar160 = auVar96._12_4_ * fVar136;
            auVar48._12_4_ = fVar160;
            fVar140 = auVar96._16_4_ * 0.0;
            auVar48._16_4_ = fVar140;
            fVar77 = auVar96._20_4_ * 0.0;
            auVar48._20_4_ = fVar77;
            fVar78 = auVar96._24_4_ * 0.0;
            auVar48._24_4_ = fVar78;
            auVar48._28_4_ = auVar88._28_4_;
            auVar91 = vsubps_avx512vl(auVar89,auVar48);
            local_280._0_4_ =
                 (float)((uint)(bVar68 & 1) * (int)fVar156 |
                        (uint)!(bool)(bVar68 & 1) * auVar91._0_4_);
            bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar72 * (int)fVar158 | (uint)!bVar72 * auVar91._4_4_);
            bVar72 = (bool)((byte)(uVar69 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar72 * (int)fVar159 | (uint)!bVar72 * auVar91._8_4_);
            bVar72 = (bool)((byte)(uVar69 >> 3) & 1);
            local_280._12_4_ = (float)((uint)bVar72 * (int)fVar160 | (uint)!bVar72 * auVar91._12_4_)
            ;
            bVar72 = (bool)((byte)(uVar69 >> 4) & 1);
            local_280._16_4_ = (float)((uint)bVar72 * (int)fVar140 | (uint)!bVar72 * auVar91._16_4_)
            ;
            bVar72 = (bool)((byte)(uVar69 >> 5) & 1);
            local_280._20_4_ = (float)((uint)bVar72 * (int)fVar77 | (uint)!bVar72 * auVar91._20_4_);
            bVar72 = (bool)((byte)(uVar69 >> 6) & 1);
            local_280._24_4_ = (float)((uint)bVar72 * (int)fVar78 | (uint)!bVar72 * auVar91._24_4_);
            bVar72 = SUB81(uVar69 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar72 * auVar88._28_4_ | (uint)!bVar72 * auVar91._28_4_);
            auVar91 = vsubps_avx(auVar98,auVar97);
            auVar81 = vfmadd213ps_fma(auVar91,local_280,auVar97);
            fVar156 = local_510->depth_scale;
            auVar27._4_4_ = fVar156;
            auVar27._0_4_ = fVar156;
            auVar27._8_4_ = fVar156;
            auVar27._12_4_ = fVar156;
            auVar27._16_4_ = fVar156;
            auVar27._20_4_ = fVar156;
            auVar27._24_4_ = fVar156;
            auVar27._28_4_ = fVar156;
            auVar91 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                         CONCAT48(auVar81._8_4_ + auVar81._8_4_,
                                                                  CONCAT44(auVar81._4_4_ +
                                                                           auVar81._4_4_,
                                                                           auVar81._0_4_ +
                                                                           auVar81._0_4_)))),auVar27
                                     );
            uVar23 = vcmpps_avx512vl(local_240,auVar91,6);
            if (((byte)uVar23 & bVar76) != 0) {
              auVar145._0_4_ = auVar87._0_4_ * fVar130;
              auVar145._4_4_ = auVar87._4_4_ * fVar134;
              auVar145._8_4_ = auVar87._8_4_ * fVar135;
              auVar145._12_4_ = auVar87._12_4_ * fVar136;
              auVar145._16_4_ = auVar87._16_4_ * 0.0;
              auVar145._20_4_ = auVar87._20_4_ * 0.0;
              auVar145._24_4_ = auVar87._24_4_ * 0.0;
              auVar145._28_4_ = 0;
              auVar91 = vsubps_avx512vl(auVar89,auVar145);
              auVar109._0_4_ =
                   (uint)(bVar68 & 1) * (int)auVar145._0_4_ |
                   (uint)!(bool)(bVar68 & 1) * auVar91._0_4_;
              bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
              auVar109._4_4_ = (uint)bVar72 * (int)auVar145._4_4_ | (uint)!bVar72 * auVar91._4_4_;
              bVar72 = (bool)((byte)(uVar69 >> 2) & 1);
              auVar109._8_4_ = (uint)bVar72 * (int)auVar145._8_4_ | (uint)!bVar72 * auVar91._8_4_;
              bVar72 = (bool)((byte)(uVar69 >> 3) & 1);
              auVar109._12_4_ = (uint)bVar72 * (int)auVar145._12_4_ | (uint)!bVar72 * auVar91._12_4_
              ;
              bVar72 = (bool)((byte)(uVar69 >> 4) & 1);
              auVar109._16_4_ = (uint)bVar72 * (int)auVar145._16_4_ | (uint)!bVar72 * auVar91._16_4_
              ;
              bVar72 = (bool)((byte)(uVar69 >> 5) & 1);
              auVar109._20_4_ = (uint)bVar72 * (int)auVar145._20_4_ | (uint)!bVar72 * auVar91._20_4_
              ;
              bVar72 = (bool)((byte)(uVar69 >> 6) & 1);
              auVar109._24_4_ = (uint)bVar72 * (int)auVar145._24_4_ | (uint)!bVar72 * auVar91._24_4_
              ;
              auVar109._28_4_ = (uint)!SUB81(uVar69 >> 7,0) * auVar91._28_4_;
              auVar28._8_4_ = 0x40000000;
              auVar28._0_8_ = 0x4000000040000000;
              auVar28._12_4_ = 0x40000000;
              auVar28._16_4_ = 0x40000000;
              auVar28._20_4_ = 0x40000000;
              auVar28._24_4_ = 0x40000000;
              auVar28._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar109,auVar89,auVar28);
              local_220 = 0;
              local_21c = iVar13;
              local_210 = local_430._0_8_;
              uStack_208 = local_430._8_8_;
              local_200 = local_440._0_8_;
              uStack_1f8 = local_440._8_8_;
              local_1f0 = local_450._0_8_;
              uStack_1e8 = local_450._8_8_;
              if ((pGVar14->mask & local_530->mask) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar72 = true, pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_01a1bcbd;
                fVar156 = 1.0 / (float)local_300._0_4_;
                local_1c0[0] = fVar156 * (local_280._0_4_ + 0.0);
                local_1c0[1] = fVar156 * (local_280._4_4_ + 1.0);
                local_1c0[2] = fVar156 * (local_280._8_4_ + 2.0);
                local_1c0[3] = fVar156 * (local_280._12_4_ + 3.0);
                fStack_1b0 = fVar156 * (local_280._16_4_ + 4.0);
                fStack_1ac = fVar156 * (local_280._20_4_ + 5.0);
                fStack_1a8 = fVar156 * (local_280._24_4_ + 6.0);
                fStack_1a4 = local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                uVar69 = 0;
                uVar70 = (ulong)((byte)uVar23 & bVar76);
                for (uVar25 = uVar70; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000)
                {
                  uVar69 = uVar69 + 1;
                }
                while (auVar81 = auVar178._0_16_, uVar70 != 0) {
                  local_2c0._0_8_ = uVar70;
                  local_4c4 = local_1c0[uVar69];
                  local_4c0 = *(undefined4 *)(local_1a0 + uVar69 * 4);
                  local_520 = CONCAT44(local_520._4_4_,local_530->tfar);
                  local_518 = uVar69;
                  local_530->tfar = *(float *)(local_180 + uVar69 * 4);
                  local_500.context = context->user;
                  fVar130 = 1.0 - local_4c4;
                  fVar156 = fVar130 * fVar130 * -3.0;
                  auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * fVar130)),
                                            ZEXT416((uint)(local_4c4 * fVar130)),ZEXT416(0xc0000000)
                                           );
                  auVar6 = vfmsub132ss_fma(ZEXT416((uint)(local_4c4 * fVar130)),
                                           ZEXT416((uint)(local_4c4 * local_4c4)),
                                           ZEXT416(0x40000000));
                  fVar130 = auVar79._0_4_ * 3.0;
                  fVar134 = auVar6._0_4_ * 3.0;
                  fVar135 = local_4c4 * local_4c4 * 3.0;
                  auVar154._0_4_ = fVar135 * (float)local_310._0_4_;
                  auVar154._4_4_ = fVar135 * (float)local_310._4_4_;
                  auVar154._8_4_ = fVar135 * fStack_308;
                  auVar154._12_4_ = fVar135 * fStack_304;
                  auVar141._4_4_ = fVar134;
                  auVar141._0_4_ = fVar134;
                  auVar141._8_4_ = fVar134;
                  auVar141._12_4_ = fVar134;
                  auVar79 = vfmadd132ps_fma(auVar141,auVar154,local_450);
                  auVar146._4_4_ = fVar130;
                  auVar146._0_4_ = fVar130;
                  auVar146._8_4_ = fVar130;
                  auVar146._12_4_ = fVar130;
                  auVar79 = vfmadd132ps_fma(auVar146,auVar79,local_440);
                  auVar142._4_4_ = fVar156;
                  auVar142._0_4_ = fVar156;
                  auVar142._8_4_ = fVar156;
                  auVar142._12_4_ = fVar156;
                  auVar79 = vfmadd132ps_fma(auVar142,auVar79,local_430);
                  local_4d0 = vmovlps_avx(auVar79);
                  local_4c8 = vextractps_avx(auVar79,2);
                  local_4bc = (int)local_488;
                  local_4b8 = (int)local_528;
                  local_4b4 = (local_500.context)->instID[0];
                  local_4b0 = (local_500.context)->instPrimID[0];
                  local_544 = -1;
                  local_500.valid = &local_544;
                  local_500.geometryUserPtr = pGVar14->userPtr;
                  local_500.ray = (RTCRayN *)local_530;
                  local_500.hit = (RTCHitN *)&local_4d0;
                  local_500.N = 1;
                  if ((pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar14->occlusionFilterN)(&local_500), *local_500.valid != 0)) {
                    p_Var16 = context->args->filter;
                    if ((p_Var16 == (RTCFilterFunctionN)0x0) ||
                       ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (((pGVar14->field_8).field_0x2 & 0x40) == 0)) ||
                        ((*p_Var16)(&local_500), *local_500.valid != 0)))) {
                      bVar72 = true;
                      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar183 = ZEXT3264(auVar91);
                      auVar81 = vxorps_avx512vl(auVar81,auVar81);
                      auVar178 = ZEXT1664(auVar81);
                      auVar176 = ZEXT3264(local_340);
                      auVar179 = ZEXT3264(local_360);
                      auVar180 = ZEXT3264(local_3c0);
                      auVar182 = ZEXT3264(local_380);
                      auVar181 = ZEXT3264(local_3e0);
                      auVar186 = ZEXT3264(local_480);
                      auVar177 = ZEXT3264(local_400);
                      auVar184 = ZEXT3264(local_420);
                      auVar185 = ZEXT3264(local_3a0);
                      goto LAB_01a1bcbd;
                    }
                  }
                  local_530->tfar = (float)local_520;
                  uVar69 = 0;
                  uVar70 = local_2c0._0_8_ ^ 1L << (local_518 & 0x3f);
                  for (uVar25 = uVar70; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000
                      ) {
                    uVar69 = uVar69 + 1;
                  }
                  auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar183 = ZEXT3264(auVar91);
                  auVar81 = vxorps_avx512vl(auVar81,auVar81);
                  auVar178 = ZEXT1664(auVar81);
                  auVar176 = ZEXT3264(local_340);
                  auVar179 = ZEXT3264(local_360);
                  auVar180 = ZEXT3264(local_3c0);
                  auVar182 = ZEXT3264(local_380);
                  auVar181 = ZEXT3264(local_3e0);
                  auVar186 = ZEXT3264(local_480);
                  auVar177 = ZEXT3264(local_400);
                  auVar184 = ZEXT3264(local_420);
                  auVar185 = ZEXT3264(local_3a0);
                }
              }
            }
          }
        }
        bVar72 = false;
      }
    }
LAB_01a1bcbd:
    if (8 < iVar13) {
      local_2c0 = vpbroadcastd_avx512vl();
      uStack_29c = local_2a0;
      uStack_298 = local_2a0;
      uStack_294 = local_2a0;
      uStack_290 = local_2a0;
      uStack_28c = local_2a0;
      uStack_288 = local_2a0;
      uStack_284 = local_2a0;
      auVar133._8_4_ = 3;
      auVar133._0_8_ = 0x300000003;
      auVar133._12_4_ = 3;
      auVar133._16_4_ = 3;
      auVar133._20_4_ = 3;
      auVar133._24_4_ = 3;
      auVar133._28_4_ = 3;
      local_2e0 = vpermps_avx2(auVar133,local_2e0);
      local_300._4_4_ = 1.0 / (float)local_300._0_4_;
      local_300._0_4_ = local_300._4_4_;
      fStack_2f8 = (float)local_300._4_4_;
      fStack_2f4 = (float)local_300._4_4_;
      fStack_2f0 = (float)local_300._4_4_;
      fStack_2ec = (float)local_300._4_4_;
      fStack_2e8 = (float)local_300._4_4_;
      fStack_2e4 = (float)local_300._4_4_;
      local_400 = auVar177._0_32_;
      local_420 = auVar184._0_32_;
      uVar69 = local_528;
      for (lVar71 = 8; lVar71 < local_540; lVar71 = lVar71 + 8) {
        auVar91 = vpbroadcastd_avx512vl();
        auVar92 = vpor_avx2(auVar91,_DAT_01fb4ba0);
        uVar24 = vpcmpd_avx512vl(auVar92,local_2c0,1);
        auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar71 * 4 + lVar75);
        auVar88 = *(undefined1 (*) [32])(lVar75 + 0x21fb768 + lVar71 * 4);
        auVar89 = *(undefined1 (*) [32])(lVar75 + 0x21fbbec + lVar71 * 4);
        auVar90 = *(undefined1 (*) [32])(lVar75 + 0x21fc070 + lVar71 * 4);
        auVar157 = auVar177._0_32_;
        auVar93 = vmulps_avx512vl(auVar157,auVar90);
        auVar170 = auVar184._0_32_;
        auVar94 = vmulps_avx512vl(auVar170,auVar90);
        auVar49._4_4_ = auVar90._4_4_ * (float)local_e0._4_4_;
        auVar49._0_4_ = auVar90._0_4_ * (float)local_e0._0_4_;
        auVar49._8_4_ = auVar90._8_4_ * fStack_d8;
        auVar49._12_4_ = auVar90._12_4_ * fStack_d4;
        auVar49._16_4_ = auVar90._16_4_ * fStack_d0;
        auVar49._20_4_ = auVar90._20_4_ * fStack_cc;
        auVar49._24_4_ = auVar90._24_4_ * fStack_c8;
        auVar49._28_4_ = auVar92._28_4_;
        auVar169 = auVar181._0_32_;
        auVar92 = vfmadd231ps_avx512vl(auVar93,auVar89,auVar169);
        auVar172 = auVar186._0_32_;
        auVar93 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar172);
        auVar81 = vfmadd231ps_fma(auVar49,auVar89,local_c0);
        auVar161 = auVar180._0_32_;
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,auVar161);
        local_380 = auVar182._0_32_;
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,local_380);
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar88,local_a0);
        local_340 = auVar176._0_32_;
        auVar87 = vfmadd231ps_avx512vl(auVar92,auVar91,local_340);
        local_360 = auVar179._0_32_;
        auVar97 = vfmadd231ps_avx512vl(auVar93,auVar91,local_360);
        auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar71 * 4 + lVar75);
        auVar93 = *(undefined1 (*) [32])(lVar75 + 0x21fdb88 + lVar71 * 4);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar91,local_100);
        auVar94 = *(undefined1 (*) [32])(lVar75 + 0x21fe00c + lVar71 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar75 + 0x21fe490 + lVar71 * 4);
        auVar95 = vmulps_avx512vl(auVar157,auVar99);
        auVar96 = vmulps_avx512vl(auVar170,auVar99);
        auVar50._4_4_ = auVar99._4_4_ * (float)local_e0._4_4_;
        auVar50._0_4_ = auVar99._0_4_ * (float)local_e0._0_4_;
        auVar50._8_4_ = auVar99._8_4_ * fStack_d8;
        auVar50._12_4_ = auVar99._12_4_ * fStack_d4;
        auVar50._16_4_ = auVar99._16_4_ * fStack_d0;
        auVar50._20_4_ = auVar99._20_4_ * fStack_cc;
        auVar50._24_4_ = auVar99._24_4_ * fStack_c8;
        auVar50._28_4_ = uStack_c4;
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar169);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar172);
        auVar81 = vfmadd231ps_fma(auVar50,auVar94,local_c0);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar161);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_380);
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar93,local_a0);
        auVar85 = vfmadd231ps_avx512vl(auVar95,auVar92,local_340);
        auVar86 = vfmadd231ps_avx512vl(auVar96,auVar92,local_360);
        auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar92,local_100);
        auVar111 = vmaxps_avx512vl(auVar98,auVar110);
        auVar95 = vsubps_avx(auVar85,auVar87);
        auVar96 = vsubps_avx(auVar86,auVar97);
        auVar112 = vmulps_avx512vl(auVar97,auVar95);
        auVar113 = vmulps_avx512vl(auVar87,auVar96);
        auVar112 = vsubps_avx512vl(auVar112,auVar113);
        auVar113 = vmulps_avx512vl(auVar96,auVar96);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar95,auVar95);
        auVar111 = vmulps_avx512vl(auVar111,auVar111);
        auVar111 = vmulps_avx512vl(auVar111,auVar113);
        auVar112 = vmulps_avx512vl(auVar112,auVar112);
        uVar23 = vcmpps_avx512vl(auVar112,auVar111,2);
        bVar76 = (byte)uVar24 & (byte)uVar23;
        if (bVar76 == 0) {
          auVar181 = ZEXT3264(auVar169);
          auVar177 = ZEXT3264(auVar157);
          auVar176 = ZEXT3264(local_340);
        }
        else {
          auVar99 = vmulps_avx512vl(local_160,auVar99);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_140,auVar99);
          auVar93 = vfmadd213ps_avx512vl(auVar93,local_120,auVar94);
          local_3a0 = auVar185._0_32_;
          auVar92 = vfmadd213ps_avx512vl(auVar92,local_3a0,auVar93);
          auVar90 = vmulps_avx512vl(local_160,auVar90);
          auVar89 = vfmadd213ps_avx512vl(auVar89,local_140,auVar90);
          auVar88 = vfmadd213ps_avx512vl(auVar88,local_120,auVar89);
          auVar93 = vfmadd213ps_avx512vl(auVar91,local_3a0,auVar88);
          auVar91 = *(undefined1 (*) [32])(lVar75 + 0x21fc4f4 + lVar71 * 4);
          auVar88 = *(undefined1 (*) [32])(lVar75 + 0x21fc978 + lVar71 * 4);
          auVar89 = *(undefined1 (*) [32])(lVar75 + 0x21fcdfc + lVar71 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar75 + 0x21fd280 + lVar71 * 4);
          auVar94 = vmulps_avx512vl(auVar157,auVar90);
          auVar99 = vmulps_avx512vl(auVar170,auVar90);
          auVar90 = vmulps_avx512vl(local_160,auVar90);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar169);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar89,auVar172);
          auVar89 = vfmadd231ps_avx512vl(auVar90,local_140,auVar89);
          auVar90 = vfmadd231ps_avx512vl(auVar94,auVar88,auVar161);
          auVar94 = vfmadd231ps_avx512vl(auVar99,auVar88,local_380);
          auVar88 = vfmadd231ps_avx512vl(auVar89,local_120,auVar88);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar91,local_340);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,local_360);
          auVar99 = vfmadd231ps_avx512vl(auVar88,local_3a0,auVar91);
          auVar91 = *(undefined1 (*) [32])(lVar75 + 0x21fe914 + lVar71 * 4);
          auVar88 = *(undefined1 (*) [32])(lVar75 + 0x21ff21c + lVar71 * 4);
          auVar89 = *(undefined1 (*) [32])(lVar75 + 0x21ff6a0 + lVar71 * 4);
          auVar111 = vmulps_avx512vl(auVar157,auVar89);
          auVar112 = vmulps_avx512vl(auVar170,auVar89);
          auVar89 = vmulps_avx512vl(local_160,auVar89);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar88,auVar169);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar88,auVar172);
          auVar89 = vfmadd231ps_avx512vl(auVar89,local_140,auVar88);
          auVar88 = *(undefined1 (*) [32])(lVar75 + 0x21fed98 + lVar71 * 4);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar88,auVar161);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar88,local_380);
          auVar88 = vfmadd231ps_avx512vl(auVar89,local_120,auVar88);
          auVar89 = vfmadd231ps_avx512vl(auVar111,auVar91,local_340);
          auVar111 = vfmadd231ps_avx512vl(auVar112,auVar91,local_360);
          auVar88 = vfmadd231ps_avx512vl(auVar88,local_3a0,auVar91);
          auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar90,auVar112);
          vandps_avx512vl(auVar94,auVar112);
          auVar91 = vmaxps_avx(auVar112,auVar112);
          vandps_avx512vl(auVar99,auVar112);
          auVar91 = vmaxps_avx(auVar91,auVar112);
          auVar67._4_4_ = uStack_29c;
          auVar67._0_4_ = local_2a0;
          auVar67._8_4_ = uStack_298;
          auVar67._12_4_ = uStack_294;
          auVar67._16_4_ = uStack_290;
          auVar67._20_4_ = uStack_28c;
          auVar67._24_4_ = uStack_288;
          auVar67._28_4_ = uStack_284;
          uVar25 = vcmpps_avx512vl(auVar91,auVar67,1);
          bVar17 = (bool)((byte)uVar25 & 1);
          auVar114._0_4_ = (float)((uint)bVar17 * auVar95._0_4_ | (uint)!bVar17 * auVar90._0_4_);
          bVar17 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar114._4_4_ = (float)((uint)bVar17 * auVar95._4_4_ | (uint)!bVar17 * auVar90._4_4_);
          bVar17 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar114._8_4_ = (float)((uint)bVar17 * auVar95._8_4_ | (uint)!bVar17 * auVar90._8_4_);
          bVar17 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar114._12_4_ = (float)((uint)bVar17 * auVar95._12_4_ | (uint)!bVar17 * auVar90._12_4_);
          bVar17 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar114._16_4_ = (float)((uint)bVar17 * auVar95._16_4_ | (uint)!bVar17 * auVar90._16_4_);
          bVar17 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar114._20_4_ = (float)((uint)bVar17 * auVar95._20_4_ | (uint)!bVar17 * auVar90._20_4_);
          bVar17 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar114._24_4_ = (float)((uint)bVar17 * auVar95._24_4_ | (uint)!bVar17 * auVar90._24_4_);
          bVar17 = SUB81(uVar25 >> 7,0);
          auVar114._28_4_ = (uint)bVar17 * auVar95._28_4_ | (uint)!bVar17 * auVar90._28_4_;
          bVar17 = (bool)((byte)uVar25 & 1);
          auVar115._0_4_ = (float)((uint)bVar17 * auVar96._0_4_ | (uint)!bVar17 * auVar94._0_4_);
          bVar17 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar94._4_4_);
          bVar17 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar94._8_4_);
          bVar17 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar94._12_4_);
          bVar17 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar115._16_4_ = (float)((uint)bVar17 * auVar96._16_4_ | (uint)!bVar17 * auVar94._16_4_);
          bVar17 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar115._20_4_ = (float)((uint)bVar17 * auVar96._20_4_ | (uint)!bVar17 * auVar94._20_4_);
          bVar17 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar115._24_4_ = (float)((uint)bVar17 * auVar96._24_4_ | (uint)!bVar17 * auVar94._24_4_);
          bVar17 = SUB81(uVar25 >> 7,0);
          auVar115._28_4_ = (uint)bVar17 * auVar96._28_4_ | (uint)!bVar17 * auVar94._28_4_;
          vandps_avx512vl(auVar89,auVar112);
          vandps_avx512vl(auVar111,auVar112);
          auVar91 = vmaxps_avx(auVar115,auVar115);
          vandps_avx512vl(auVar88,auVar112);
          auVar91 = vmaxps_avx(auVar91,auVar115);
          uVar25 = vcmpps_avx512vl(auVar91,auVar67,1);
          bVar17 = (bool)((byte)uVar25 & 1);
          auVar116._0_4_ = (uint)bVar17 * auVar95._0_4_ | (uint)!bVar17 * auVar89._0_4_;
          bVar17 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar116._4_4_ = (uint)bVar17 * auVar95._4_4_ | (uint)!bVar17 * auVar89._4_4_;
          bVar17 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar116._8_4_ = (uint)bVar17 * auVar95._8_4_ | (uint)!bVar17 * auVar89._8_4_;
          bVar17 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar116._12_4_ = (uint)bVar17 * auVar95._12_4_ | (uint)!bVar17 * auVar89._12_4_;
          bVar17 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar116._16_4_ = (uint)bVar17 * auVar95._16_4_ | (uint)!bVar17 * auVar89._16_4_;
          bVar17 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar116._20_4_ = (uint)bVar17 * auVar95._20_4_ | (uint)!bVar17 * auVar89._20_4_;
          bVar17 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar116._24_4_ = (uint)bVar17 * auVar95._24_4_ | (uint)!bVar17 * auVar89._24_4_;
          bVar17 = SUB81(uVar25 >> 7,0);
          auVar116._28_4_ = (uint)bVar17 * auVar95._28_4_ | (uint)!bVar17 * auVar89._28_4_;
          bVar17 = (bool)((byte)uVar25 & 1);
          auVar117._0_4_ = (float)((uint)bVar17 * auVar96._0_4_ | (uint)!bVar17 * auVar111._0_4_);
          bVar17 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar17 * auVar96._4_4_ | (uint)!bVar17 * auVar111._4_4_);
          bVar17 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * auVar111._8_4_);
          bVar17 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar17 * auVar96._12_4_ | (uint)!bVar17 * auVar111._12_4_)
          ;
          bVar17 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar117._16_4_ = (float)((uint)bVar17 * auVar96._16_4_ | (uint)!bVar17 * auVar111._16_4_)
          ;
          bVar17 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar117._20_4_ = (float)((uint)bVar17 * auVar96._20_4_ | (uint)!bVar17 * auVar111._20_4_)
          ;
          bVar17 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar117._24_4_ = (float)((uint)bVar17 * auVar96._24_4_ | (uint)!bVar17 * auVar111._24_4_)
          ;
          bVar17 = SUB81(uVar25 >> 7,0);
          auVar117._28_4_ = (uint)bVar17 * auVar96._28_4_ | (uint)!bVar17 * auVar111._28_4_;
          auVar164._8_4_ = 0x80000000;
          auVar164._0_8_ = 0x8000000080000000;
          auVar164._12_4_ = 0x80000000;
          auVar164._16_4_ = 0x80000000;
          auVar164._20_4_ = 0x80000000;
          auVar164._24_4_ = 0x80000000;
          auVar164._28_4_ = 0x80000000;
          auVar91 = vxorps_avx512vl(auVar116,auVar164);
          auVar111 = auVar178._0_32_;
          auVar88 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar111);
          auVar81 = vfmadd231ps_fma(auVar88,auVar115,auVar115);
          auVar88 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
          auVar175._8_4_ = 0xbf000000;
          auVar175._0_8_ = 0xbf000000bf000000;
          auVar175._12_4_ = 0xbf000000;
          auVar175._16_4_ = 0xbf000000;
          auVar175._20_4_ = 0xbf000000;
          auVar175._24_4_ = 0xbf000000;
          auVar175._28_4_ = 0xbf000000;
          fVar156 = auVar88._0_4_;
          fVar130 = auVar88._4_4_;
          fVar134 = auVar88._8_4_;
          fVar135 = auVar88._12_4_;
          fVar136 = auVar88._16_4_;
          fVar158 = auVar88._20_4_;
          fVar159 = auVar88._24_4_;
          auVar51._4_4_ = fVar130 * fVar130 * fVar130 * auVar81._4_4_ * -0.5;
          auVar51._0_4_ = fVar156 * fVar156 * fVar156 * auVar81._0_4_ * -0.5;
          auVar51._8_4_ = fVar134 * fVar134 * fVar134 * auVar81._8_4_ * -0.5;
          auVar51._12_4_ = fVar135 * fVar135 * fVar135 * auVar81._12_4_ * -0.5;
          auVar51._16_4_ = fVar136 * fVar136 * fVar136 * -0.0;
          auVar51._20_4_ = fVar158 * fVar158 * fVar158 * -0.0;
          auVar51._24_4_ = fVar159 * fVar159 * fVar159 * -0.0;
          auVar51._28_4_ = auVar115._28_4_;
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar88 = vfmadd231ps_avx512vl(auVar51,auVar89,auVar88);
          auVar52._4_4_ = auVar115._4_4_ * auVar88._4_4_;
          auVar52._0_4_ = auVar115._0_4_ * auVar88._0_4_;
          auVar52._8_4_ = auVar115._8_4_ * auVar88._8_4_;
          auVar52._12_4_ = auVar115._12_4_ * auVar88._12_4_;
          auVar52._16_4_ = auVar115._16_4_ * auVar88._16_4_;
          auVar52._20_4_ = auVar115._20_4_ * auVar88._20_4_;
          auVar52._24_4_ = auVar115._24_4_ * auVar88._24_4_;
          auVar52._28_4_ = 0;
          auVar53._4_4_ = auVar88._4_4_ * -auVar114._4_4_;
          auVar53._0_4_ = auVar88._0_4_ * -auVar114._0_4_;
          auVar53._8_4_ = auVar88._8_4_ * -auVar114._8_4_;
          auVar53._12_4_ = auVar88._12_4_ * -auVar114._12_4_;
          auVar53._16_4_ = auVar88._16_4_ * -auVar114._16_4_;
          auVar53._20_4_ = auVar88._20_4_ * -auVar114._20_4_;
          auVar53._24_4_ = auVar88._24_4_ * -auVar114._24_4_;
          auVar53._28_4_ = auVar115._28_4_;
          auVar90 = vmulps_avx512vl(auVar88,auVar111);
          auVar88 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar111);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar117,auVar117);
          auVar94 = vrsqrt14ps_avx512vl(auVar88);
          auVar88 = vmulps_avx512vl(auVar88,auVar175);
          fVar156 = auVar94._0_4_;
          fVar130 = auVar94._4_4_;
          fVar134 = auVar94._8_4_;
          fVar135 = auVar94._12_4_;
          fVar136 = auVar94._16_4_;
          fVar158 = auVar94._20_4_;
          fVar159 = auVar94._24_4_;
          auVar54._4_4_ = fVar130 * fVar130 * fVar130 * auVar88._4_4_;
          auVar54._0_4_ = fVar156 * fVar156 * fVar156 * auVar88._0_4_;
          auVar54._8_4_ = fVar134 * fVar134 * fVar134 * auVar88._8_4_;
          auVar54._12_4_ = fVar135 * fVar135 * fVar135 * auVar88._12_4_;
          auVar54._16_4_ = fVar136 * fVar136 * fVar136 * auVar88._16_4_;
          auVar54._20_4_ = fVar158 * fVar158 * fVar158 * auVar88._20_4_;
          auVar54._24_4_ = fVar159 * fVar159 * fVar159 * auVar88._24_4_;
          auVar54._28_4_ = auVar88._28_4_;
          auVar88 = vfmadd231ps_avx512vl(auVar54,auVar89,auVar94);
          auVar55._4_4_ = auVar117._4_4_ * auVar88._4_4_;
          auVar55._0_4_ = auVar117._0_4_ * auVar88._0_4_;
          auVar55._8_4_ = auVar117._8_4_ * auVar88._8_4_;
          auVar55._12_4_ = auVar117._12_4_ * auVar88._12_4_;
          auVar55._16_4_ = auVar117._16_4_ * auVar88._16_4_;
          auVar55._20_4_ = auVar117._20_4_ * auVar88._20_4_;
          auVar55._24_4_ = auVar117._24_4_ * auVar88._24_4_;
          auVar55._28_4_ = auVar94._28_4_;
          auVar56._4_4_ = auVar88._4_4_ * auVar91._4_4_;
          auVar56._0_4_ = auVar88._0_4_ * auVar91._0_4_;
          auVar56._8_4_ = auVar88._8_4_ * auVar91._8_4_;
          auVar56._12_4_ = auVar88._12_4_ * auVar91._12_4_;
          auVar56._16_4_ = auVar88._16_4_ * auVar91._16_4_;
          auVar56._20_4_ = auVar88._20_4_ * auVar91._20_4_;
          auVar56._24_4_ = auVar88._24_4_ * auVar91._24_4_;
          auVar56._28_4_ = auVar91._28_4_;
          auVar91 = vmulps_avx512vl(auVar88,auVar111);
          auVar81 = vfmadd213ps_fma(auVar52,auVar98,auVar87);
          auVar79 = vfmadd213ps_fma(auVar53,auVar98,auVar97);
          auVar89 = vfmadd213ps_avx512vl(auVar90,auVar98,auVar93);
          auVar94 = vfmadd213ps_avx512vl(auVar55,auVar110,auVar85);
          auVar11 = vfnmadd213ps_fma(auVar52,auVar98,auVar87);
          auVar6 = vfmadd213ps_fma(auVar56,auVar110,auVar86);
          auVar12 = vfnmadd213ps_fma(auVar53,auVar98,auVar97);
          auVar7 = vfmadd213ps_fma(auVar91,auVar110,auVar92);
          auVar138 = vfnmadd231ps_fma(auVar93,auVar98,auVar90);
          auVar137 = vfnmadd213ps_fma(auVar55,auVar110,auVar85);
          auVar80 = vfnmadd213ps_fma(auVar56,auVar110,auVar86);
          auVar141 = vfnmadd231ps_fma(auVar92,auVar110,auVar91);
          auVar92 = vsubps_avx512vl(auVar94,ZEXT1632(auVar11));
          auVar91 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar12));
          auVar88 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar138));
          auVar57._4_4_ = auVar91._4_4_ * auVar138._4_4_;
          auVar57._0_4_ = auVar91._0_4_ * auVar138._0_4_;
          auVar57._8_4_ = auVar91._8_4_ * auVar138._8_4_;
          auVar57._12_4_ = auVar91._12_4_ * auVar138._12_4_;
          auVar57._16_4_ = auVar91._16_4_ * 0.0;
          auVar57._20_4_ = auVar91._20_4_ * 0.0;
          auVar57._24_4_ = auVar91._24_4_ * 0.0;
          auVar57._28_4_ = auVar90._28_4_;
          auVar8 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar12),auVar88);
          auVar58._4_4_ = auVar88._4_4_ * auVar11._4_4_;
          auVar58._0_4_ = auVar88._0_4_ * auVar11._0_4_;
          auVar58._8_4_ = auVar88._8_4_ * auVar11._8_4_;
          auVar58._12_4_ = auVar88._12_4_ * auVar11._12_4_;
          auVar58._16_4_ = auVar88._16_4_ * 0.0;
          auVar58._20_4_ = auVar88._20_4_ * 0.0;
          auVar58._24_4_ = auVar88._24_4_ * 0.0;
          auVar58._28_4_ = auVar88._28_4_;
          auVar9 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar138),auVar92);
          auVar59._4_4_ = auVar12._4_4_ * auVar92._4_4_;
          auVar59._0_4_ = auVar12._0_4_ * auVar92._0_4_;
          auVar59._8_4_ = auVar12._8_4_ * auVar92._8_4_;
          auVar59._12_4_ = auVar12._12_4_ * auVar92._12_4_;
          auVar59._16_4_ = auVar92._16_4_ * 0.0;
          auVar59._20_4_ = auVar92._20_4_ * 0.0;
          auVar59._24_4_ = auVar92._24_4_ * 0.0;
          auVar59._28_4_ = auVar92._28_4_;
          auVar10 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar11),auVar91);
          auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar111,ZEXT1632(auVar9));
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar111,ZEXT1632(auVar8));
          uVar25 = vcmpps_avx512vl(auVar91,auVar111,2);
          bVar68 = (byte)uVar25;
          fVar77 = (float)((uint)(bVar68 & 1) * auVar81._0_4_ |
                          (uint)!(bool)(bVar68 & 1) * auVar137._0_4_);
          bVar17 = (bool)((byte)(uVar25 >> 1) & 1);
          fVar124 = (float)((uint)bVar17 * auVar81._4_4_ | (uint)!bVar17 * auVar137._4_4_);
          bVar17 = (bool)((byte)(uVar25 >> 2) & 1);
          fVar126 = (float)((uint)bVar17 * auVar81._8_4_ | (uint)!bVar17 * auVar137._8_4_);
          bVar17 = (bool)((byte)(uVar25 >> 3) & 1);
          fVar128 = (float)((uint)bVar17 * auVar81._12_4_ | (uint)!bVar17 * auVar137._12_4_);
          auVar99 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar126,CONCAT44(fVar124,fVar77))));
          fVar78 = (float)((uint)(bVar68 & 1) * auVar79._0_4_ |
                          (uint)!(bool)(bVar68 & 1) * auVar80._0_4_);
          bVar17 = (bool)((byte)(uVar25 >> 1) & 1);
          fVar125 = (float)((uint)bVar17 * auVar79._4_4_ | (uint)!bVar17 * auVar80._4_4_);
          bVar17 = (bool)((byte)(uVar25 >> 2) & 1);
          fVar127 = (float)((uint)bVar17 * auVar79._8_4_ | (uint)!bVar17 * auVar80._8_4_);
          bVar17 = (bool)((byte)(uVar25 >> 3) & 1);
          fVar129 = (float)((uint)bVar17 * auVar79._12_4_ | (uint)!bVar17 * auVar80._12_4_);
          auVar95 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar127,CONCAT44(fVar125,fVar78))));
          auVar118._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar89._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar141._0_4_);
          bVar17 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar17 * auVar89._4_4_ | (uint)!bVar17 * auVar141._4_4_);
          bVar17 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar17 * auVar89._8_4_ | (uint)!bVar17 * auVar141._8_4_);
          bVar17 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar17 * auVar89._12_4_ | (uint)!bVar17 * auVar141._12_4_)
          ;
          fVar156 = (float)((uint)((byte)(uVar25 >> 4) & 1) * auVar89._16_4_);
          auVar118._16_4_ = fVar156;
          fVar130 = (float)((uint)((byte)(uVar25 >> 5) & 1) * auVar89._20_4_);
          auVar118._20_4_ = fVar130;
          fVar134 = (float)((uint)((byte)(uVar25 >> 6) & 1) * auVar89._24_4_);
          auVar118._24_4_ = fVar134;
          iVar1 = (uint)(byte)(uVar25 >> 7) * auVar89._28_4_;
          auVar118._28_4_ = iVar1;
          auVar91 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar94);
          auVar119._0_4_ =
               (uint)(bVar68 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar8._0_4_;
          bVar17 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar119._4_4_ = (uint)bVar17 * auVar91._4_4_ | (uint)!bVar17 * auVar8._4_4_;
          bVar17 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar119._8_4_ = (uint)bVar17 * auVar91._8_4_ | (uint)!bVar17 * auVar8._8_4_;
          bVar17 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar119._12_4_ = (uint)bVar17 * auVar91._12_4_ | (uint)!bVar17 * auVar8._12_4_;
          auVar119._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar91._16_4_;
          auVar119._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar91._20_4_;
          auVar119._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar91._24_4_;
          auVar119._28_4_ = (uint)(byte)(uVar25 >> 7) * auVar91._28_4_;
          auVar91 = vblendmps_avx512vl(ZEXT1632(auVar12),ZEXT1632(auVar6));
          auVar120._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar91._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar81._0_4_);
          bVar17 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar17 * auVar91._4_4_ | (uint)!bVar17 * auVar81._4_4_);
          bVar17 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar17 * auVar91._8_4_ | (uint)!bVar17 * auVar81._8_4_);
          bVar17 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar17 * auVar91._12_4_ | (uint)!bVar17 * auVar81._12_4_);
          fVar135 = (float)((uint)((byte)(uVar25 >> 4) & 1) * auVar91._16_4_);
          auVar120._16_4_ = fVar135;
          fVar136 = (float)((uint)((byte)(uVar25 >> 5) & 1) * auVar91._20_4_);
          auVar120._20_4_ = fVar136;
          fVar158 = (float)((uint)((byte)(uVar25 >> 6) & 1) * auVar91._24_4_);
          auVar120._24_4_ = fVar158;
          auVar120._28_4_ = (uint)(byte)(uVar25 >> 7) * auVar91._28_4_;
          auVar91 = vblendmps_avx512vl(ZEXT1632(auVar138),ZEXT1632(auVar7));
          auVar121._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar91._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar79._0_4_);
          bVar17 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar17 * auVar91._4_4_ | (uint)!bVar17 * auVar79._4_4_);
          bVar17 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar17 * auVar91._8_4_ | (uint)!bVar17 * auVar79._8_4_);
          bVar17 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar17 * auVar91._12_4_ | (uint)!bVar17 * auVar79._12_4_);
          fVar140 = (float)((uint)((byte)(uVar25 >> 4) & 1) * auVar91._16_4_);
          auVar121._16_4_ = fVar140;
          fVar160 = (float)((uint)((byte)(uVar25 >> 5) & 1) * auVar91._20_4_);
          auVar121._20_4_ = fVar160;
          fVar159 = (float)((uint)((byte)(uVar25 >> 6) & 1) * auVar91._24_4_);
          auVar121._24_4_ = fVar159;
          iVar2 = (uint)(byte)(uVar25 >> 7) * auVar91._28_4_;
          auVar121._28_4_ = iVar2;
          auVar122._0_4_ =
               (uint)(bVar68 & 1) * (int)auVar11._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar94._0_4_;
          bVar17 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar17 * (int)auVar11._4_4_ | (uint)!bVar17 * auVar94._4_4_;
          bVar17 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar17 * (int)auVar11._8_4_ | (uint)!bVar17 * auVar94._8_4_;
          bVar17 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar17 * (int)auVar11._12_4_ | (uint)!bVar17 * auVar94._12_4_;
          auVar122._16_4_ = (uint)!(bool)((byte)(uVar25 >> 4) & 1) * auVar94._16_4_;
          auVar122._20_4_ = (uint)!(bool)((byte)(uVar25 >> 5) & 1) * auVar94._20_4_;
          auVar122._24_4_ = (uint)!(bool)((byte)(uVar25 >> 6) & 1) * auVar94._24_4_;
          auVar122._28_4_ = (uint)!SUB81(uVar25 >> 7,0) * auVar94._28_4_;
          bVar17 = (bool)((byte)(uVar25 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar25 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar25 >> 3) & 1);
          bVar18 = (bool)((byte)(uVar25 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar25 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar94 = vsubps_avx512vl(auVar122,auVar99);
          auVar88 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar12._12_4_ |
                                                  (uint)!bVar21 * auVar6._12_4_,
                                                  CONCAT48((uint)bVar19 * (int)auVar12._8_4_ |
                                                           (uint)!bVar19 * auVar6._8_4_,
                                                           CONCAT44((uint)bVar17 *
                                                                    (int)auVar12._4_4_ |
                                                                    (uint)!bVar17 * auVar6._4_4_,
                                                                    (uint)(bVar68 & 1) *
                                                                    (int)auVar12._0_4_ |
                                                                    (uint)!(bool)(bVar68 & 1) *
                                                                    auVar6._0_4_)))),auVar95);
          auVar89 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar138._12_4_ |
                                                  (uint)!bVar22 * auVar7._12_4_,
                                                  CONCAT48((uint)bVar20 * (int)auVar138._8_4_ |
                                                           (uint)!bVar20 * auVar7._8_4_,
                                                           CONCAT44((uint)bVar18 *
                                                                    (int)auVar138._4_4_ |
                                                                    (uint)!bVar18 * auVar7._4_4_,
                                                                    (uint)(bVar68 & 1) *
                                                                    (int)auVar138._0_4_ |
                                                                    (uint)!(bool)(bVar68 & 1) *
                                                                    auVar7._0_4_)))),auVar118);
          auVar90 = vsubps_avx(auVar99,auVar119);
          auVar92 = vsubps_avx(auVar95,auVar120);
          auVar93 = vsubps_avx(auVar118,auVar121);
          auVar60._4_4_ = auVar89._4_4_ * fVar124;
          auVar60._0_4_ = auVar89._0_4_ * fVar77;
          auVar60._8_4_ = auVar89._8_4_ * fVar126;
          auVar60._12_4_ = auVar89._12_4_ * fVar128;
          auVar60._16_4_ = auVar89._16_4_ * 0.0;
          auVar60._20_4_ = auVar89._20_4_ * 0.0;
          auVar60._24_4_ = auVar89._24_4_ * 0.0;
          auVar60._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar60,auVar118,auVar94);
          auVar149._0_4_ = fVar78 * auVar94._0_4_;
          auVar149._4_4_ = fVar125 * auVar94._4_4_;
          auVar149._8_4_ = fVar127 * auVar94._8_4_;
          auVar149._12_4_ = fVar129 * auVar94._12_4_;
          auVar149._16_4_ = auVar94._16_4_ * 0.0;
          auVar149._20_4_ = auVar94._20_4_ * 0.0;
          auVar149._24_4_ = auVar94._24_4_ * 0.0;
          auVar149._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar149,auVar99,auVar88);
          auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar111,ZEXT1632(auVar81));
          auVar152._0_4_ = auVar88._0_4_ * auVar118._0_4_;
          auVar152._4_4_ = auVar88._4_4_ * auVar118._4_4_;
          auVar152._8_4_ = auVar88._8_4_ * auVar118._8_4_;
          auVar152._12_4_ = auVar88._12_4_ * auVar118._12_4_;
          auVar152._16_4_ = auVar88._16_4_ * fVar156;
          auVar152._20_4_ = auVar88._20_4_ * fVar130;
          auVar152._24_4_ = auVar88._24_4_ * fVar134;
          auVar152._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar152,auVar95,auVar89);
          auVar96 = vfmadd231ps_avx512vl(auVar91,auVar111,ZEXT1632(auVar81));
          auVar91 = vmulps_avx512vl(auVar93,auVar119);
          auVar91 = vfmsub231ps_avx512vl(auVar91,auVar90,auVar121);
          auVar61._4_4_ = auVar92._4_4_ * auVar121._4_4_;
          auVar61._0_4_ = auVar92._0_4_ * auVar121._0_4_;
          auVar61._8_4_ = auVar92._8_4_ * auVar121._8_4_;
          auVar61._12_4_ = auVar92._12_4_ * auVar121._12_4_;
          auVar61._16_4_ = auVar92._16_4_ * fVar140;
          auVar61._20_4_ = auVar92._20_4_ * fVar160;
          auVar61._24_4_ = auVar92._24_4_ * fVar159;
          auVar61._28_4_ = iVar2;
          auVar81 = vfmsub231ps_fma(auVar61,auVar120,auVar93);
          auVar153._0_4_ = auVar120._0_4_ * auVar90._0_4_;
          auVar153._4_4_ = auVar120._4_4_ * auVar90._4_4_;
          auVar153._8_4_ = auVar120._8_4_ * auVar90._8_4_;
          auVar153._12_4_ = auVar120._12_4_ * auVar90._12_4_;
          auVar153._16_4_ = fVar135 * auVar90._16_4_;
          auVar153._20_4_ = fVar136 * auVar90._20_4_;
          auVar153._24_4_ = fVar158 * auVar90._24_4_;
          auVar153._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar153,auVar92,auVar119);
          auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar111,auVar91);
          auVar87 = vfmadd231ps_avx512vl(auVar91,auVar111,ZEXT1632(auVar81));
          auVar91 = vmaxps_avx(auVar96,auVar87);
          uVar23 = vcmpps_avx512vl(auVar91,auVar111,2);
          bVar76 = bVar76 & (byte)uVar23;
          auVar181 = ZEXT3264(auVar169);
          if (bVar76 != 0) {
            auVar62._4_4_ = auVar93._4_4_ * auVar88._4_4_;
            auVar62._0_4_ = auVar93._0_4_ * auVar88._0_4_;
            auVar62._8_4_ = auVar93._8_4_ * auVar88._8_4_;
            auVar62._12_4_ = auVar93._12_4_ * auVar88._12_4_;
            auVar62._16_4_ = auVar93._16_4_ * auVar88._16_4_;
            auVar62._20_4_ = auVar93._20_4_ * auVar88._20_4_;
            auVar62._24_4_ = auVar93._24_4_ * auVar88._24_4_;
            auVar62._28_4_ = auVar91._28_4_;
            auVar6 = vfmsub231ps_fma(auVar62,auVar92,auVar89);
            auVar63._4_4_ = auVar89._4_4_ * auVar90._4_4_;
            auVar63._0_4_ = auVar89._0_4_ * auVar90._0_4_;
            auVar63._8_4_ = auVar89._8_4_ * auVar90._8_4_;
            auVar63._12_4_ = auVar89._12_4_ * auVar90._12_4_;
            auVar63._16_4_ = auVar89._16_4_ * auVar90._16_4_;
            auVar63._20_4_ = auVar89._20_4_ * auVar90._20_4_;
            auVar63._24_4_ = auVar89._24_4_ * auVar90._24_4_;
            auVar63._28_4_ = auVar89._28_4_;
            auVar79 = vfmsub231ps_fma(auVar63,auVar94,auVar93);
            auVar64._4_4_ = auVar92._4_4_ * auVar94._4_4_;
            auVar64._0_4_ = auVar92._0_4_ * auVar94._0_4_;
            auVar64._8_4_ = auVar92._8_4_ * auVar94._8_4_;
            auVar64._12_4_ = auVar92._12_4_ * auVar94._12_4_;
            auVar64._16_4_ = auVar92._16_4_ * auVar94._16_4_;
            auVar64._20_4_ = auVar92._20_4_ * auVar94._20_4_;
            auVar64._24_4_ = auVar92._24_4_ * auVar94._24_4_;
            auVar64._28_4_ = auVar92._28_4_;
            auVar7 = vfmsub231ps_fma(auVar64,auVar90,auVar88);
            auVar81 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar79),ZEXT1632(auVar7));
            auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar6),auVar111);
            auVar88 = vrcp14ps_avx512vl(auVar91);
            auVar90 = auVar183._0_32_;
            auVar89 = vfnmadd213ps_avx512vl(auVar88,auVar91,auVar90);
            auVar81 = vfmadd132ps_fma(auVar89,auVar88,auVar88);
            auVar65._4_4_ = auVar7._4_4_ * auVar118._4_4_;
            auVar65._0_4_ = auVar7._0_4_ * auVar118._0_4_;
            auVar65._8_4_ = auVar7._8_4_ * auVar118._8_4_;
            auVar65._12_4_ = auVar7._12_4_ * auVar118._12_4_;
            auVar65._16_4_ = fVar156 * 0.0;
            auVar65._20_4_ = fVar130 * 0.0;
            auVar65._24_4_ = fVar134 * 0.0;
            auVar65._28_4_ = iVar1;
            auVar79 = vfmadd231ps_fma(auVar65,auVar95,ZEXT1632(auVar79));
            auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar99,ZEXT1632(auVar6));
            fVar130 = auVar81._0_4_;
            fVar134 = auVar81._4_4_;
            fVar135 = auVar81._8_4_;
            fVar136 = auVar81._12_4_;
            local_240 = ZEXT1632(CONCAT412(auVar79._12_4_ * fVar136,
                                           CONCAT48(auVar79._8_4_ * fVar135,
                                                    CONCAT44(auVar79._4_4_ * fVar134,
                                                             auVar79._0_4_ * fVar130))));
            uVar23 = vcmpps_avx512vl(local_240,local_2e0,0xd);
            fVar156 = local_530->tfar;
            auVar30._4_4_ = fVar156;
            auVar30._0_4_ = fVar156;
            auVar30._8_4_ = fVar156;
            auVar30._12_4_ = fVar156;
            auVar30._16_4_ = fVar156;
            auVar30._20_4_ = fVar156;
            auVar30._24_4_ = fVar156;
            auVar30._28_4_ = fVar156;
            uVar24 = vcmpps_avx512vl(local_240,auVar30,2);
            bVar76 = (byte)uVar23 & (byte)uVar24 & bVar76;
            if (bVar76 != 0) {
              uVar23 = vcmpps_avx512vl(auVar91,auVar111,4);
              bVar76 = bVar76 & (byte)uVar23;
              auVar186 = ZEXT3264(local_480);
              auVar177 = ZEXT3264(local_400);
              auVar184 = ZEXT3264(local_420);
              auVar176 = ZEXT3264(local_340);
              if (bVar76 != 0) {
                fVar156 = auVar96._0_4_ * fVar130;
                fVar158 = auVar96._4_4_ * fVar134;
                auVar66._4_4_ = fVar158;
                auVar66._0_4_ = fVar156;
                fVar159 = auVar96._8_4_ * fVar135;
                auVar66._8_4_ = fVar159;
                fVar160 = auVar96._12_4_ * fVar136;
                auVar66._12_4_ = fVar160;
                fVar140 = auVar96._16_4_ * 0.0;
                auVar66._16_4_ = fVar140;
                fVar77 = auVar96._20_4_ * 0.0;
                auVar66._20_4_ = fVar77;
                fVar78 = auVar96._24_4_ * 0.0;
                auVar66._24_4_ = fVar78;
                auVar66._28_4_ = auVar91._28_4_;
                auVar88 = vsubps_avx512vl(auVar90,auVar66);
                local_280._0_4_ =
                     (float)((uint)(bVar68 & 1) * (int)fVar156 |
                            (uint)!(bool)(bVar68 & 1) * auVar88._0_4_);
                bVar17 = (bool)((byte)(uVar25 >> 1) & 1);
                local_280._4_4_ =
                     (float)((uint)bVar17 * (int)fVar158 | (uint)!bVar17 * auVar88._4_4_);
                bVar17 = (bool)((byte)(uVar25 >> 2) & 1);
                local_280._8_4_ =
                     (float)((uint)bVar17 * (int)fVar159 | (uint)!bVar17 * auVar88._8_4_);
                bVar17 = (bool)((byte)(uVar25 >> 3) & 1);
                local_280._12_4_ =
                     (float)((uint)bVar17 * (int)fVar160 | (uint)!bVar17 * auVar88._12_4_);
                bVar17 = (bool)((byte)(uVar25 >> 4) & 1);
                local_280._16_4_ =
                     (float)((uint)bVar17 * (int)fVar140 | (uint)!bVar17 * auVar88._16_4_);
                bVar17 = (bool)((byte)(uVar25 >> 5) & 1);
                local_280._20_4_ =
                     (float)((uint)bVar17 * (int)fVar77 | (uint)!bVar17 * auVar88._20_4_);
                bVar17 = (bool)((byte)(uVar25 >> 6) & 1);
                local_280._24_4_ =
                     (float)((uint)bVar17 * (int)fVar78 | (uint)!bVar17 * auVar88._24_4_);
                bVar17 = SUB81(uVar25 >> 7,0);
                local_280._28_4_ =
                     (float)((uint)bVar17 * auVar91._28_4_ | (uint)!bVar17 * auVar88._28_4_);
                auVar91 = vsubps_avx(auVar110,auVar98);
                auVar81 = vfmadd213ps_fma(auVar91,local_280,auVar98);
                fVar156 = local_510->depth_scale;
                auVar31._4_4_ = fVar156;
                auVar31._0_4_ = fVar156;
                auVar31._8_4_ = fVar156;
                auVar31._12_4_ = fVar156;
                auVar31._16_4_ = fVar156;
                auVar31._20_4_ = fVar156;
                auVar31._24_4_ = fVar156;
                auVar31._28_4_ = fVar156;
                auVar91 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                             CONCAT48(auVar81._8_4_ + auVar81._8_4_,
                                                                      CONCAT44(auVar81._4_4_ +
                                                                               auVar81._4_4_,
                                                                               auVar81._0_4_ +
                                                                               auVar81._0_4_)))),
                                          auVar31);
                uVar23 = vcmpps_avx512vl(local_240,auVar91,6);
                if (((byte)uVar23 & bVar76) != 0) {
                  auVar139._0_4_ = auVar87._0_4_ * fVar130;
                  auVar139._4_4_ = auVar87._4_4_ * fVar134;
                  auVar139._8_4_ = auVar87._8_4_ * fVar135;
                  auVar139._12_4_ = auVar87._12_4_ * fVar136;
                  auVar139._16_4_ = auVar87._16_4_ * 0.0;
                  auVar139._20_4_ = auVar87._20_4_ * 0.0;
                  auVar139._24_4_ = auVar87._24_4_ * 0.0;
                  auVar139._28_4_ = 0;
                  auVar91 = vsubps_avx512vl(auVar90,auVar139);
                  auVar123._0_4_ =
                       (uint)(bVar68 & 1) * (int)auVar139._0_4_ |
                       (uint)!(bool)(bVar68 & 1) * auVar91._0_4_;
                  bVar17 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar123._4_4_ =
                       (uint)bVar17 * (int)auVar139._4_4_ | (uint)!bVar17 * auVar91._4_4_;
                  bVar17 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar123._8_4_ =
                       (uint)bVar17 * (int)auVar139._8_4_ | (uint)!bVar17 * auVar91._8_4_;
                  bVar17 = (bool)((byte)(uVar25 >> 3) & 1);
                  auVar123._12_4_ =
                       (uint)bVar17 * (int)auVar139._12_4_ | (uint)!bVar17 * auVar91._12_4_;
                  bVar17 = (bool)((byte)(uVar25 >> 4) & 1);
                  auVar123._16_4_ =
                       (uint)bVar17 * (int)auVar139._16_4_ | (uint)!bVar17 * auVar91._16_4_;
                  bVar17 = (bool)((byte)(uVar25 >> 5) & 1);
                  auVar123._20_4_ =
                       (uint)bVar17 * (int)auVar139._20_4_ | (uint)!bVar17 * auVar91._20_4_;
                  bVar17 = (bool)((byte)(uVar25 >> 6) & 1);
                  auVar123._24_4_ =
                       (uint)bVar17 * (int)auVar139._24_4_ | (uint)!bVar17 * auVar91._24_4_;
                  auVar123._28_4_ = (uint)!SUB81(uVar25 >> 7,0) * auVar91._28_4_;
                  auVar32._8_4_ = 0x40000000;
                  auVar32._0_8_ = 0x4000000040000000;
                  auVar32._12_4_ = 0x40000000;
                  auVar32._16_4_ = 0x40000000;
                  auVar32._20_4_ = 0x40000000;
                  auVar32._24_4_ = 0x40000000;
                  auVar32._28_4_ = 0x40000000;
                  local_260 = vfmsub132ps_avx512vl(auVar123,auVar90,auVar32);
                  local_220 = (int)lVar71;
                  local_21c = iVar13;
                  local_210 = local_430._0_8_;
                  uStack_208 = local_430._8_8_;
                  local_200 = local_440._0_8_;
                  uStack_1f8 = local_440._8_8_;
                  local_1f0 = local_450._0_8_;
                  uStack_1e8 = local_450._8_8_;
                  pGVar14 = (context->scene->geometries).items[uVar69].ptr;
                  if ((pGVar14->mask & local_530->mask) == 0) {
                    bVar68 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar68 = 1, pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_490 = pGVar14;
                    auVar81 = vcvtsi2ss_avx512f(auVar178._0_16_,(int)lVar71);
                    fVar156 = auVar81._0_4_;
                    local_1c0[0] = (fVar156 + local_280._0_4_ + 0.0) * (float)local_300._0_4_;
                    local_1c0[1] = (fVar156 + local_280._4_4_ + 1.0) * (float)local_300._4_4_;
                    local_1c0[2] = (fVar156 + local_280._8_4_ + 2.0) * fStack_2f8;
                    local_1c0[3] = (fVar156 + local_280._12_4_ + 3.0) * fStack_2f4;
                    fStack_1b0 = (fVar156 + local_280._16_4_ + 4.0) * fStack_2f0;
                    fStack_1ac = (fVar156 + local_280._20_4_ + 5.0) * fStack_2ec;
                    fStack_1a8 = (fVar156 + local_280._24_4_ + 6.0) * fStack_2e8;
                    fStack_1a4 = fVar156 + local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    uVar69 = 0;
                    local_518 = (ulong)((byte)uVar23 & bVar76);
                    for (uVar25 = local_518; (uVar25 & 1) == 0;
                        uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                      uVar69 = uVar69 + 1;
                    }
                    local_498 = context;
                    while (local_518 != 0) {
                      local_4c4 = local_1c0[uVar69];
                      local_4c0 = *(undefined4 *)(local_1a0 + uVar69 * 4);
                      local_504 = local_530->tfar;
                      local_520 = uVar69;
                      local_530->tfar = *(float *)(local_180 + uVar69 * 4);
                      local_500.context = local_498->user;
                      fVar130 = 1.0 - local_4c4;
                      fVar156 = fVar130 * fVar130 * -3.0;
                      auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * fVar130)),
                                                ZEXT416((uint)(local_4c4 * fVar130)),
                                                ZEXT416(0xc0000000));
                      auVar79 = vfmsub132ss_fma(ZEXT416((uint)(local_4c4 * fVar130)),
                                                ZEXT416((uint)(local_4c4 * local_4c4)),
                                                ZEXT416(0x40000000));
                      fVar130 = auVar81._0_4_ * 3.0;
                      fVar134 = auVar79._0_4_ * 3.0;
                      fVar135 = local_4c4 * local_4c4 * 3.0;
                      auVar155._0_4_ = fVar135 * (float)local_310._0_4_;
                      auVar155._4_4_ = fVar135 * (float)local_310._4_4_;
                      auVar155._8_4_ = fVar135 * fStack_308;
                      auVar155._12_4_ = fVar135 * fStack_304;
                      auVar143._4_4_ = fVar134;
                      auVar143._0_4_ = fVar134;
                      auVar143._8_4_ = fVar134;
                      auVar143._12_4_ = fVar134;
                      auVar81 = vfmadd132ps_fma(auVar143,auVar155,local_450);
                      auVar147._4_4_ = fVar130;
                      auVar147._0_4_ = fVar130;
                      auVar147._8_4_ = fVar130;
                      auVar147._12_4_ = fVar130;
                      auVar81 = vfmadd132ps_fma(auVar147,auVar81,local_440);
                      auVar144._4_4_ = fVar156;
                      auVar144._0_4_ = fVar156;
                      auVar144._8_4_ = fVar156;
                      auVar144._12_4_ = fVar156;
                      auVar81 = vfmadd132ps_fma(auVar144,auVar81,local_430);
                      local_4d0 = vmovlps_avx(auVar81);
                      local_4c8 = vextractps_avx(auVar81,2);
                      local_4bc = (int)local_488;
                      local_4b8 = (int)local_528;
                      local_4b4 = (local_500.context)->instID[0];
                      local_4b0 = (local_500.context)->instPrimID[0];
                      local_544 = -1;
                      local_500.valid = &local_544;
                      local_500.geometryUserPtr = local_490->userPtr;
                      local_500.ray = (RTCRayN *)local_530;
                      local_500.hit = (RTCHitN *)&local_4d0;
                      local_500.N = 1;
                      if ((local_490->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*local_490->occlusionFilterN)(&local_500), *local_500.valid != 0)) {
                        auVar81 = auVar178._0_16_;
                        p_Var16 = local_498->args->filter;
                        if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                           (((local_498->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((local_490->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var16)(&local_500);
                          auVar81 = auVar178._0_16_;
                          if (*local_500.valid == 0) goto LAB_01a1c655;
                        }
                        bVar68 = 1;
                        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar81 = vxorps_avx512vl(auVar81,auVar81);
                        goto LAB_01a1c714;
                      }
LAB_01a1c655:
                      local_530->tfar = local_504;
                      uVar69 = 0;
                      local_518 = local_518 ^ 1L << (local_520 & 0x3f);
                      for (uVar25 = local_518; (uVar25 & 1) == 0;
                          uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                        uVar69 = uVar69 + 1;
                      }
                    }
                    bVar68 = 0;
                    auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar81 = vxorps_avx512vl(auVar178._0_16_,auVar178._0_16_);
LAB_01a1c714:
                    auVar183 = ZEXT3264(auVar91);
                    auVar178 = ZEXT1664(auVar81);
                    auVar176 = ZEXT3264(local_340);
                    auVar179 = ZEXT3264(local_360);
                    auVar180 = ZEXT3264(local_3c0);
                    auVar182 = ZEXT3264(local_380);
                    auVar181 = ZEXT3264(local_3e0);
                    auVar186 = ZEXT3264(local_480);
                    auVar177 = ZEXT3264(local_400);
                    auVar184 = ZEXT3264(local_420);
                    auVar185 = ZEXT3264(local_3a0);
                    context = local_498;
                    uVar69 = local_528;
                  }
                  bVar72 = (bool)(bVar72 | bVar68);
                }
              }
              goto LAB_01a1c695;
            }
          }
          auVar186 = ZEXT3264(local_480);
          auVar177 = ZEXT3264(local_400);
          auVar184 = ZEXT3264(local_420);
          auVar176 = ZEXT3264(local_340);
        }
LAB_01a1c695:
      }
    }
    if (bVar72) break;
    fVar156 = local_530->tfar;
    auVar29._4_4_ = fVar156;
    auVar29._0_4_ = fVar156;
    auVar29._8_4_ = fVar156;
    auVar29._12_4_ = fVar156;
    auVar29._16_4_ = fVar156;
    auVar29._20_4_ = fVar156;
    auVar29._24_4_ = fVar156;
    auVar29._28_4_ = fVar156;
    uVar23 = vcmpps_avx512vl(local_80,auVar29,2);
  }
  return uVar74 != 0;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }